

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersector1<8>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  int iVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [12];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [28];
  uint uVar116;
  uint uVar117;
  uint uVar118;
  ulong uVar119;
  ulong uVar120;
  Geometry *pGVar121;
  ulong uVar122;
  long lVar123;
  undefined4 uVar124;
  undefined8 uVar125;
  float fVar141;
  undefined1 auVar126 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar140;
  float fVar142;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined8 uVar146;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar161;
  undefined1 auVar163 [16];
  float fVar162;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar164 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  float fVar207;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 in_ZMM10 [64];
  undefined4 uVar218;
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar229;
  undefined1 in_ZMM12 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_7cc;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [56];
  ulong local_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  Primitive *local_700;
  Precalculations *local_6f8;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_670;
  undefined4 local_668;
  float local_664;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 local_658;
  uint local_654;
  uint local_650;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [2] [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar224 [32];
  
  PVar17 = prim[1];
  uVar122 = (ulong)(byte)PVar17;
  fVar162 = *(float *)(prim + uVar122 * 0x19 + 0x12);
  auVar20 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar122 * 0x19 + 6));
  auVar126._0_4_ = fVar162 * auVar20._0_4_;
  auVar126._4_4_ = fVar162 * auVar20._4_4_;
  auVar126._8_4_ = fVar162 * auVar20._8_4_;
  auVar126._12_4_ = fVar162 * auVar20._12_4_;
  auVar202._0_4_ = fVar162 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar202._4_4_ = fVar162 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar202._8_4_ = fVar162 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar202._12_4_ = fVar162 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar122 * 4 + 6);
  auVar136 = vpmovsxbd_avx2(auVar20);
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar122 * 5 + 6);
  auVar198 = vpmovsxbd_avx2(auVar10);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar122 * 6 + 6);
  auVar134 = vpmovsxbd_avx2(auVar11);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar122 * 0xb + 6);
  auVar152 = vpmovsxbd_avx2(auVar12);
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar17 * 0xc) + 6);
  auVar174 = vpmovsxbd_avx2(auVar13);
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + (uint)(byte)PVar17 * 0xc + uVar122 + 6);
  auVar209 = vpmovsxbd_avx2(auVar196);
  auVar209 = vcvtdq2ps_avx(auVar209);
  uVar119 = (ulong)(uint)((int)(uVar122 * 9) * 2);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar119 + 6);
  auVar21 = vpmovsxbd_avx2(auVar14);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar119 + uVar122 + 6);
  auVar22 = vpmovsxbd_avx2(auVar15);
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar119 = (ulong)(uint)((int)(uVar122 * 5) << 2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar119 + 6);
  auVar23 = vpmovsxbd_avx2(auVar16);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar233._4_4_ = auVar202._0_4_;
  auVar233._0_4_ = auVar202._0_4_;
  auVar233._8_4_ = auVar202._0_4_;
  auVar233._12_4_ = auVar202._0_4_;
  auVar233._16_4_ = auVar202._0_4_;
  auVar233._20_4_ = auVar202._0_4_;
  auVar233._24_4_ = auVar202._0_4_;
  auVar233._28_4_ = auVar202._0_4_;
  auVar20 = vmovshdup_avx(auVar202);
  uVar125 = auVar20._0_8_;
  auVar237._8_8_ = uVar125;
  auVar237._0_8_ = uVar125;
  auVar237._16_8_ = uVar125;
  auVar237._24_8_ = uVar125;
  auVar20 = vshufps_avx(auVar202,auVar202,0xaa);
  fVar162 = auVar20._0_4_;
  auVar227._0_4_ = fVar162 * auVar134._0_4_;
  fVar161 = auVar20._4_4_;
  auVar227._4_4_ = fVar161 * auVar134._4_4_;
  auVar227._8_4_ = fVar162 * auVar134._8_4_;
  auVar227._12_4_ = fVar161 * auVar134._12_4_;
  auVar227._16_4_ = fVar162 * auVar134._16_4_;
  auVar227._20_4_ = fVar161 * auVar134._20_4_;
  auVar227._28_36_ = in_ZMM12._28_36_;
  auVar227._24_4_ = fVar162 * auVar134._24_4_;
  auVar200._0_4_ = auVar209._0_4_ * fVar162;
  auVar200._4_4_ = auVar209._4_4_ * fVar161;
  auVar200._8_4_ = auVar209._8_4_ * fVar162;
  auVar200._12_4_ = auVar209._12_4_ * fVar161;
  auVar200._16_4_ = auVar209._16_4_ * fVar162;
  auVar200._20_4_ = auVar209._20_4_ * fVar161;
  auVar200._28_36_ = in_ZMM10._28_36_;
  auVar200._24_4_ = auVar209._24_4_ * fVar162;
  auVar214._0_4_ = auVar23._0_4_ * fVar162;
  auVar214._4_4_ = auVar23._4_4_ * fVar161;
  auVar214._8_4_ = auVar23._8_4_ * fVar162;
  auVar214._12_4_ = auVar23._12_4_ * fVar161;
  auVar214._16_4_ = auVar23._16_4_ * fVar162;
  auVar214._20_4_ = auVar23._20_4_ * fVar161;
  auVar214._24_4_ = auVar23._24_4_ * fVar162;
  auVar214._28_4_ = 0;
  auVar20 = vfmadd231ps_fma(auVar227._0_32_,auVar237,auVar198);
  auVar10 = vfmadd231ps_fma(auVar200._0_32_,auVar237,auVar174);
  auVar11 = vfmadd231ps_fma(auVar214,auVar22,auVar237);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar233,auVar136);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar233,auVar152);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar21,auVar233);
  auVar234._4_4_ = auVar126._0_4_;
  auVar234._0_4_ = auVar126._0_4_;
  auVar234._8_4_ = auVar126._0_4_;
  auVar234._12_4_ = auVar126._0_4_;
  auVar234._16_4_ = auVar126._0_4_;
  auVar234._20_4_ = auVar126._0_4_;
  auVar234._24_4_ = auVar126._0_4_;
  auVar234._28_4_ = auVar126._0_4_;
  auVar20 = vmovshdup_avx(auVar126);
  uVar125 = auVar20._0_8_;
  auVar238._8_8_ = uVar125;
  auVar238._0_8_ = uVar125;
  auVar238._16_8_ = uVar125;
  auVar238._24_8_ = uVar125;
  auVar20 = vshufps_avx(auVar126,auVar126,0xaa);
  fVar162 = auVar20._0_4_;
  auVar204._0_4_ = fVar162 * auVar134._0_4_;
  fVar161 = auVar20._4_4_;
  auVar204._4_4_ = fVar161 * auVar134._4_4_;
  auVar204._8_4_ = fVar162 * auVar134._8_4_;
  auVar204._12_4_ = fVar161 * auVar134._12_4_;
  auVar204._16_4_ = fVar162 * auVar134._16_4_;
  auVar204._20_4_ = fVar161 * auVar134._20_4_;
  auVar204._24_4_ = fVar162 * auVar134._24_4_;
  auVar204._28_4_ = 0;
  auVar128._4_4_ = auVar209._4_4_ * fVar161;
  auVar128._0_4_ = auVar209._0_4_ * fVar162;
  auVar128._8_4_ = auVar209._8_4_ * fVar162;
  auVar128._12_4_ = auVar209._12_4_ * fVar161;
  auVar128._16_4_ = auVar209._16_4_ * fVar162;
  auVar128._20_4_ = auVar209._20_4_ * fVar161;
  auVar128._24_4_ = auVar209._24_4_ * fVar162;
  auVar128._28_4_ = auVar134._28_4_;
  auVar134._4_4_ = auVar23._4_4_ * fVar161;
  auVar134._0_4_ = auVar23._0_4_ * fVar162;
  auVar134._8_4_ = auVar23._8_4_ * fVar162;
  auVar134._12_4_ = auVar23._12_4_ * fVar161;
  auVar134._16_4_ = auVar23._16_4_ * fVar162;
  auVar134._20_4_ = auVar23._20_4_ * fVar161;
  auVar134._24_4_ = auVar23._24_4_ * fVar162;
  auVar134._28_4_ = fVar161;
  auVar20 = vfmadd231ps_fma(auVar204,auVar238,auVar198);
  auVar13 = vfmadd231ps_fma(auVar128,auVar238,auVar174);
  auVar196 = vfmadd231ps_fma(auVar134,auVar238,auVar22);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar234,auVar136);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar234,auVar152);
  local_180._8_4_ = 0x7fffffff;
  local_180._0_8_ = 0x7fffffff7fffffff;
  local_180._12_4_ = 0x7fffffff;
  local_180._16_4_ = 0x7fffffff;
  local_180._20_4_ = 0x7fffffff;
  local_180._24_4_ = 0x7fffffff;
  local_180._28_4_ = 0x7fffffff;
  auVar173._8_4_ = 0x219392ef;
  auVar173._0_8_ = 0x219392ef219392ef;
  auVar173._12_4_ = 0x219392ef;
  auVar173._16_4_ = 0x219392ef;
  auVar173._20_4_ = 0x219392ef;
  auVar173._24_4_ = 0x219392ef;
  auVar173._28_4_ = 0x219392ef;
  auVar136 = vandps_avx(ZEXT1632(auVar12),local_180);
  auVar136 = vcmpps_avx(auVar136,auVar173,1);
  auVar198 = vblendvps_avx(ZEXT1632(auVar12),auVar173,auVar136);
  auVar136 = vandps_avx(ZEXT1632(auVar10),local_180);
  auVar136 = vcmpps_avx(auVar136,auVar173,1);
  auVar134 = vblendvps_avx(ZEXT1632(auVar10),auVar173,auVar136);
  auVar136 = vandps_avx(ZEXT1632(auVar11),local_180);
  auVar136 = vcmpps_avx(auVar136,auVar173,1);
  auVar136 = vblendvps_avx(ZEXT1632(auVar11),auVar173,auVar136);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar234,auVar21);
  auVar152 = vrcpps_avx(auVar198);
  auVar192._8_4_ = 0x3f800000;
  auVar192._0_8_ = 0x3f8000003f800000;
  auVar192._12_4_ = 0x3f800000;
  auVar192._16_4_ = 0x3f800000;
  auVar192._20_4_ = 0x3f800000;
  auVar192._24_4_ = 0x3f800000;
  auVar192._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar198,auVar152,auVar192);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar152,auVar152);
  auVar198 = vrcpps_avx(auVar134);
  auVar10 = vfnmadd213ps_fma(auVar134,auVar198,auVar192);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar198,auVar198);
  auVar198 = vrcpps_avx(auVar136);
  auVar11 = vfnmadd213ps_fma(auVar136,auVar198,auVar192);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar198,auVar198);
  auVar136 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar122 * 7 + 6));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar136 = vsubps_avx(auVar136,ZEXT1632(auVar14));
  auVar152._4_4_ = auVar20._4_4_ * auVar136._4_4_;
  auVar152._0_4_ = auVar20._0_4_ * auVar136._0_4_;
  auVar152._8_4_ = auVar20._8_4_ * auVar136._8_4_;
  auVar152._12_4_ = auVar20._12_4_ * auVar136._12_4_;
  auVar152._16_4_ = auVar136._16_4_ * 0.0;
  auVar152._20_4_ = auVar136._20_4_ * 0.0;
  auVar152._24_4_ = auVar136._24_4_ * 0.0;
  auVar152._28_4_ = auVar136._28_4_;
  auVar136 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar122 * 9 + 6));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar136 = vsubps_avx(auVar136,ZEXT1632(auVar14));
  auVar174._4_4_ = auVar20._4_4_ * auVar136._4_4_;
  auVar174._0_4_ = auVar20._0_4_ * auVar136._0_4_;
  auVar174._8_4_ = auVar20._8_4_ * auVar136._8_4_;
  auVar174._12_4_ = auVar20._12_4_ * auVar136._12_4_;
  auVar174._16_4_ = auVar136._16_4_ * 0.0;
  auVar174._20_4_ = auVar136._20_4_ * 0.0;
  auVar174._24_4_ = auVar136._24_4_ * 0.0;
  auVar174._28_4_ = auVar136._28_4_;
  auVar147._1_3_ = 0;
  auVar147[0] = PVar17;
  auVar198 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar17 * 0x10 + 6));
  auVar136 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar17 * 0x10 + uVar122 * -2 + 6));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar136 = vsubps_avx(auVar136,ZEXT1632(auVar13));
  auVar209._4_4_ = auVar136._4_4_ * auVar10._4_4_;
  auVar209._0_4_ = auVar136._0_4_ * auVar10._0_4_;
  auVar209._8_4_ = auVar136._8_4_ * auVar10._8_4_;
  auVar209._12_4_ = auVar136._12_4_ * auVar10._12_4_;
  auVar209._16_4_ = auVar136._16_4_ * 0.0;
  auVar209._20_4_ = auVar136._20_4_ * 0.0;
  auVar209._24_4_ = auVar136._24_4_ * 0.0;
  auVar209._28_4_ = auVar136._28_4_;
  auVar136 = vcvtdq2ps_avx(auVar198);
  auVar136 = vsubps_avx(auVar136,ZEXT1632(auVar13));
  auVar21._4_4_ = auVar10._4_4_ * auVar136._4_4_;
  auVar21._0_4_ = auVar10._0_4_ * auVar136._0_4_;
  auVar21._8_4_ = auVar10._8_4_ * auVar136._8_4_;
  auVar21._12_4_ = auVar10._12_4_ * auVar136._12_4_;
  auVar21._16_4_ = auVar136._16_4_ * 0.0;
  auVar21._20_4_ = auVar136._20_4_ * 0.0;
  auVar21._24_4_ = auVar136._24_4_ * 0.0;
  auVar21._28_4_ = auVar136._28_4_;
  auVar136 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar119 + uVar122 + 6));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar136 = vsubps_avx(auVar136,ZEXT1632(auVar12));
  auVar22._4_4_ = auVar136._4_4_ * auVar11._4_4_;
  auVar22._0_4_ = auVar136._0_4_ * auVar11._0_4_;
  auVar22._8_4_ = auVar136._8_4_ * auVar11._8_4_;
  auVar22._12_4_ = auVar136._12_4_ * auVar11._12_4_;
  auVar22._16_4_ = auVar136._16_4_ * 0.0;
  auVar22._20_4_ = auVar136._20_4_ * 0.0;
  auVar22._24_4_ = auVar136._24_4_ * 0.0;
  auVar22._28_4_ = auVar136._28_4_;
  auVar136 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar122 * 0x17 + 6));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar136 = vsubps_avx(auVar136,ZEXT1632(auVar12));
  auVar23._4_4_ = auVar11._4_4_ * auVar136._4_4_;
  auVar23._0_4_ = auVar11._0_4_ * auVar136._0_4_;
  auVar23._8_4_ = auVar11._8_4_ * auVar136._8_4_;
  auVar23._12_4_ = auVar11._12_4_ * auVar136._12_4_;
  auVar23._16_4_ = auVar136._16_4_ * 0.0;
  auVar23._20_4_ = auVar136._20_4_ * 0.0;
  auVar23._24_4_ = auVar136._24_4_ * 0.0;
  auVar23._28_4_ = auVar136._28_4_;
  auVar136 = vpminsd_avx2(auVar152,auVar174);
  auVar198 = vpminsd_avx2(auVar209,auVar21);
  auVar136 = vmaxps_avx(auVar136,auVar198);
  uVar124 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar205._4_4_ = uVar124;
  auVar205._0_4_ = uVar124;
  auVar205._8_4_ = uVar124;
  auVar205._12_4_ = uVar124;
  auVar205._16_4_ = uVar124;
  auVar205._20_4_ = uVar124;
  auVar205._24_4_ = uVar124;
  auVar205._28_4_ = uVar124;
  auVar198 = vpminsd_avx2(auVar22,auVar23);
  auVar198 = vmaxps_avx(auVar198,auVar205);
  auVar136 = vmaxps_avx(auVar136,auVar198);
  local_80._4_4_ = auVar136._4_4_ * 0.99999964;
  local_80._0_4_ = auVar136._0_4_ * 0.99999964;
  local_80._8_4_ = auVar136._8_4_ * 0.99999964;
  local_80._12_4_ = auVar136._12_4_ * 0.99999964;
  local_80._16_4_ = auVar136._16_4_ * 0.99999964;
  local_80._20_4_ = auVar136._20_4_ * 0.99999964;
  local_80._24_4_ = auVar136._24_4_ * 0.99999964;
  local_80._28_4_ = auVar198._28_4_;
  auVar136 = vpmaxsd_avx2(auVar152,auVar174);
  auVar198 = vpmaxsd_avx2(auVar209,auVar21);
  auVar136 = vminps_avx(auVar136,auVar198);
  auVar198 = vpmaxsd_avx2(auVar22,auVar23);
  fVar162 = (ray->super_RayK<1>).tfar;
  auVar137._4_4_ = fVar162;
  auVar137._0_4_ = fVar162;
  auVar137._8_4_ = fVar162;
  auVar137._12_4_ = fVar162;
  auVar137._16_4_ = fVar162;
  auVar137._20_4_ = fVar162;
  auVar137._24_4_ = fVar162;
  auVar137._28_4_ = fVar162;
  auVar198 = vminps_avx(auVar198,auVar137);
  auVar136 = vminps_avx(auVar136,auVar198);
  auVar155._4_4_ = auVar136._4_4_ * 1.0000004;
  auVar155._0_4_ = auVar136._0_4_ * 1.0000004;
  auVar155._8_4_ = auVar136._8_4_ * 1.0000004;
  auVar155._12_4_ = auVar136._12_4_ * 1.0000004;
  auVar155._16_4_ = auVar136._16_4_ * 1.0000004;
  auVar155._20_4_ = auVar136._20_4_ * 1.0000004;
  auVar155._24_4_ = auVar136._24_4_ * 1.0000004;
  auVar155._28_4_ = auVar136._28_4_;
  auVar147[4] = PVar17;
  auVar147._5_3_ = 0;
  auVar147[8] = PVar17;
  auVar147._9_3_ = 0;
  auVar147[0xc] = PVar17;
  auVar147._13_3_ = 0;
  auVar147[0x10] = PVar17;
  auVar147._17_3_ = 0;
  auVar147[0x14] = PVar17;
  auVar147._21_3_ = 0;
  auVar147[0x18] = PVar17;
  auVar147._25_3_ = 0;
  auVar147[0x1c] = PVar17;
  auVar147._29_3_ = 0;
  auVar198 = vpcmpgtd_avx2(auVar147,_DAT_01fe9900);
  auVar136 = vcmpps_avx(local_80,auVar155,2);
  auVar136 = vandps_avx(auVar136,auVar198);
  uVar116 = vmovmskps_avx(auVar136);
  if (uVar116 != 0) {
    uVar116 = uVar116 & 0xff;
    local_560[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_560[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_560[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_560[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_2d0 = 0x7fffffff;
    uStack_2cc = 0x7fffffff;
    uStack_2c8 = 0x7fffffff;
    uStack_2c4 = 0x7fffffff;
    local_700 = prim;
    local_6f8 = pre;
    do {
      auVar136 = local_4c0;
      lVar25 = 0;
      uVar122 = (ulong)uVar116;
      for (uVar119 = uVar122; (uVar119 & 1) == 0; uVar119 = uVar119 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar116 = *(uint *)(prim + 2);
      uVar118 = *(uint *)(prim + lVar25 * 4 + 6);
      local_7c8 = (ulong)uVar116;
      pGVar121 = (context->scene->geometries).items[uVar116].ptr;
      local_748 = (ulong)uVar118;
      uVar119 = (ulong)*(uint *)(*(long *)&pGVar121->field_0x58 +
                                pGVar121[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar118);
      p_Var19 = pGVar121[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar121[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar25 + (long)p_Var19 * uVar119);
      local_710 = *(undefined8 *)*pauVar1;
      uStack_708 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar25 + (uVar119 + 1) * (long)p_Var19);
      local_720 = *(undefined8 *)*pauVar2;
      uStack_718 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar119 + 2) * (long)p_Var19);
      local_730 = *(undefined8 *)*pauVar3;
      uStack_728 = *(undefined8 *)(*pauVar3 + 8);
      uVar122 = uVar122 - 1 & uVar122;
      pauVar4 = (undefined1 (*) [12])(lVar25 + (uVar119 + 3) * (long)p_Var19);
      local_220 = *(undefined8 *)*pauVar4;
      uStack_218 = *(undefined8 *)(*pauVar4 + 8);
      local_740 = (float)local_220;
      fStack_73c = (float)((ulong)local_220 >> 0x20);
      fStack_738 = (float)uStack_218;
      fStack_734 = (float)((ulong)uStack_218 >> 0x20);
      if (uVar122 != 0) {
        uVar120 = uVar122 - 1 & uVar122;
        for (uVar119 = uVar122; (uVar119 & 1) == 0; uVar119 = uVar119 >> 1 | 0x8000000000000000) {
        }
        if (uVar120 != 0) {
          for (; (uVar120 & 1) == 0; uVar120 = uVar120 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar18 = (int)pGVar121[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar7 = (ray->super_RayK<1>).org.field_0;
      auVar10 = vsubps_avx(*pauVar1,(undefined1  [16])aVar7);
      uVar124 = auVar10._0_4_;
      auVar176._4_4_ = uVar124;
      auVar176._0_4_ = uVar124;
      auVar176._8_4_ = uVar124;
      auVar176._12_4_ = uVar124;
      auVar20 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      aVar8 = (pre->ray_space).vx.field_0;
      aVar9 = (pre->ray_space).vy.field_0;
      fVar162 = (pre->ray_space).vz.field_0.m128[0];
      fVar161 = (pre->ray_space).vz.field_0.m128[1];
      fVar140 = (pre->ray_space).vz.field_0.m128[2];
      fVar141 = (pre->ray_space).vz.field_0.m128[3];
      auVar186._0_4_ = auVar10._0_4_ * fVar162;
      auVar186._4_4_ = auVar10._4_4_ * fVar161;
      auVar186._8_4_ = auVar10._8_4_ * fVar140;
      auVar186._12_4_ = auVar10._12_4_ * fVar141;
      auVar20 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar9,auVar20);
      auVar196 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar8,auVar176);
      auVar20 = vblendps_avx(auVar196,*pauVar1,8);
      auVar11 = vsubps_avx(*pauVar2,(undefined1  [16])aVar7);
      uVar124 = auVar11._0_4_;
      auVar187._4_4_ = uVar124;
      auVar187._0_4_ = uVar124;
      auVar187._8_4_ = uVar124;
      auVar187._12_4_ = uVar124;
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar217._0_4_ = auVar11._0_4_ * fVar162;
      auVar217._4_4_ = auVar11._4_4_ * fVar161;
      auVar217._8_4_ = auVar11._8_4_ * fVar140;
      auVar217._12_4_ = auVar11._12_4_ * fVar141;
      auVar10 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar9,auVar10);
      auVar14 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar8,auVar187);
      auVar10 = vblendps_avx(auVar14,*pauVar2,8);
      auVar12 = vsubps_avx(*pauVar3,(undefined1  [16])aVar7);
      uVar124 = auVar12._0_4_;
      auVar197._4_4_ = uVar124;
      auVar197._0_4_ = uVar124;
      auVar197._8_4_ = uVar124;
      auVar197._12_4_ = uVar124;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar219._0_4_ = auVar12._0_4_ * fVar162;
      auVar219._4_4_ = auVar12._4_4_ * fVar161;
      auVar219._8_4_ = auVar12._8_4_ * fVar140;
      auVar219._12_4_ = auVar12._12_4_ * fVar141;
      auVar11 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar9,auVar11);
      auVar15 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar8,auVar197);
      auVar11 = vblendps_avx(auVar15,*pauVar3,8);
      auVar26._12_4_ = fStack_734;
      auVar26._0_12_ = *pauVar4;
      local_5c0._0_16_ = (undefined1  [16])aVar7;
      auVar13 = vsubps_avx(auVar26,(undefined1  [16])aVar7);
      uVar124 = auVar13._0_4_;
      auVar203._4_4_ = uVar124;
      auVar203._0_4_ = uVar124;
      auVar203._8_4_ = uVar124;
      auVar203._12_4_ = uVar124;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar223._0_4_ = auVar13._0_4_ * fVar162;
      auVar223._4_4_ = auVar13._4_4_ * fVar161;
      auVar223._8_4_ = auVar13._8_4_ * fVar140;
      auVar223._12_4_ = auVar13._12_4_ * fVar141;
      auVar12 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar9,auVar12);
      auVar16 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar8,auVar203);
      auVar12 = vblendps_avx(auVar16,auVar26,8);
      auVar28._4_4_ = uStack_2cc;
      auVar28._0_4_ = local_2d0;
      auVar28._8_4_ = uStack_2c8;
      auVar28._12_4_ = uStack_2c4;
      auVar20 = vandps_avx(auVar20,auVar28);
      auVar10 = vandps_avx(auVar10,auVar28);
      auVar13 = vmaxps_avx(auVar20,auVar10);
      auVar20 = vandps_avx(auVar11,auVar28);
      auVar10 = vandps_avx(auVar12,auVar28);
      auVar20 = vmaxps_avx(auVar20,auVar10);
      auVar20 = vmaxps_avx(auVar13,auVar20);
      auVar10 = vmovshdup_avx(auVar20);
      auVar10 = vmaxss_avx(auVar10,auVar20);
      auVar20 = vshufpd_avx(auVar20,auVar20,1);
      auVar20 = vmaxss_avx(auVar20,auVar10);
      lVar25 = (long)iVar18 * 0x44;
      auVar10 = vmovshdup_avx(auVar196);
      uVar125 = auVar10._0_8_;
      local_480._8_8_ = uVar125;
      local_480._0_8_ = uVar125;
      local_480._16_8_ = uVar125;
      local_480._24_8_ = uVar125;
      auVar10 = vmovshdup_avx(auVar14);
      uVar125 = auVar10._0_8_;
      local_4a0._8_8_ = uVar125;
      local_4a0._0_8_ = uVar125;
      local_4a0._16_8_ = uVar125;
      local_4a0._24_8_ = uVar125;
      auVar198 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      uVar218 = auVar15._0_4_;
      local_620._4_4_ = uVar218;
      local_620._0_4_ = uVar218;
      local_620._8_4_ = uVar218;
      local_620._12_4_ = uVar218;
      local_620._16_4_ = uVar218;
      local_620._20_4_ = uVar218;
      local_620._24_4_ = uVar218;
      local_620._28_4_ = uVar218;
      auVar10 = vmovshdup_avx(auVar15);
      uVar125 = auVar10._0_8_;
      local_580._8_8_ = uVar125;
      local_580._0_8_ = uVar125;
      local_580._16_8_ = uVar125;
      local_580._24_8_ = uVar125;
      fVar229 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar25 + 0xd8c);
      fVar90 = *(float *)(bezier_basis0 + lVar25 + 0xd90);
      fVar91 = *(float *)(bezier_basis0 + lVar25 + 0xd94);
      fVar92 = *(float *)(bezier_basis0 + lVar25 + 0xd98);
      fVar93 = *(float *)(bezier_basis0 + lVar25 + 0xd9c);
      fVar94 = *(float *)(bezier_basis0 + lVar25 + 0xda0);
      fVar95 = *(float *)(bezier_basis0 + lVar25 + 0xda4);
      auVar115 = *(undefined1 (*) [28])(bezier_basis0 + lVar25 + 0xd8c);
      local_460 = auVar16._0_4_;
      auVar10 = vmovshdup_avx(auVar16);
      uVar125 = auVar10._0_8_;
      auVar230._0_4_ = fVar229 * local_460;
      auVar230._4_4_ = fVar90 * local_460;
      auVar230._8_4_ = fVar91 * local_460;
      auVar230._12_4_ = fVar92 * local_460;
      auVar230._16_4_ = fVar93 * local_460;
      auVar230._20_4_ = fVar94 * local_460;
      auVar230._24_4_ = fVar95 * local_460;
      auVar230._28_4_ = 0;
      local_600 = auVar10._0_4_;
      auVar127._0_4_ = local_600 * fVar229;
      fStack_5fc = auVar10._4_4_;
      auVar127._4_4_ = fStack_5fc * fVar90;
      auVar127._8_4_ = local_600 * fVar91;
      auVar127._12_4_ = fStack_5fc * fVar92;
      auVar127._16_4_ = local_600 * fVar93;
      auVar127._20_4_ = fStack_5fc * fVar94;
      auVar127._24_4_ = local_600 * fVar95;
      auVar127._28_4_ = 0;
      auVar10 = vfmadd231ps_fma(auVar230,auVar198,local_620);
      auVar11 = vfmadd231ps_fma(auVar127,auVar198,local_580);
      auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      uVar124 = auVar14._0_4_;
      local_6a0._4_4_ = uVar124;
      local_6a0._0_4_ = uVar124;
      local_6a0._8_4_ = uVar124;
      local_6a0._12_4_ = uVar124;
      local_6a0._16_4_ = uVar124;
      local_6a0._20_4_ = uVar124;
      local_6a0._24_4_ = uVar124;
      local_6a0._28_4_ = uVar124;
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar134,local_6a0);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,local_4a0);
      auVar152 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      uVar124 = auVar196._0_4_;
      local_6c0._4_4_ = uVar124;
      local_6c0._0_4_ = uVar124;
      local_6c0._8_4_ = uVar124;
      local_6c0._12_4_ = uVar124;
      local_6c0._16_4_ = uVar124;
      local_6c0._20_4_ = uVar124;
      local_6c0._24_4_ = uVar124;
      local_6c0._28_4_ = uVar124;
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar152,local_6c0);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar152,local_480);
      auVar174 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      fVar96 = *(float *)(bezier_basis1 + lVar25 + 0xd8c);
      fVar97 = *(float *)(bezier_basis1 + lVar25 + 0xd90);
      fVar98 = *(float *)(bezier_basis1 + lVar25 + 0xd94);
      fVar99 = *(float *)(bezier_basis1 + lVar25 + 0xd98);
      fVar100 = *(float *)(bezier_basis1 + lVar25 + 0xd9c);
      fVar101 = *(float *)(bezier_basis1 + lVar25 + 0xda0);
      fVar102 = *(float *)(bezier_basis1 + lVar25 + 0xda4);
      fStack_45c = local_460;
      fStack_458 = local_460;
      fStack_454 = local_460;
      fStack_450 = local_460;
      fStack_44c = local_460;
      fStack_448 = local_460;
      fStack_444 = local_460;
      auVar29._4_4_ = fVar97 * local_460;
      auVar29._0_4_ = fVar96 * local_460;
      auVar29._8_4_ = fVar98 * local_460;
      auVar29._12_4_ = fVar99 * local_460;
      auVar29._16_4_ = fVar100 * local_460;
      auVar29._20_4_ = fVar101 * local_460;
      auVar29._24_4_ = fVar102 * local_460;
      auVar29._28_4_ = local_460;
      auVar12 = vfmadd231ps_fma(auVar29,auVar174,local_620);
      auVar30._4_4_ = fStack_5fc * fVar97;
      auVar30._0_4_ = local_600 * fVar96;
      auVar30._8_4_ = local_600 * fVar98;
      auVar30._12_4_ = fStack_5fc * fVar99;
      auVar30._16_4_ = local_600 * fVar100;
      auVar30._20_4_ = fStack_5fc * fVar101;
      auVar30._24_4_ = local_600 * fVar102;
      auVar30._28_4_ = uVar218;
      auVar13 = vfmadd231ps_fma(auVar30,auVar174,local_580);
      auVar209 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar209,local_6a0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar209,local_4a0);
      auVar21 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar21,local_6c0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar21,local_480);
      local_300 = ZEXT1632(auVar12);
      local_340 = ZEXT1632(auVar10);
      local_3c0 = vsubps_avx(local_300,local_340);
      local_320 = ZEXT1632(auVar13);
      auVar128 = ZEXT1632(auVar11);
      _local_360 = vsubps_avx(local_320,auVar128);
      auVar129._0_4_ = local_3c0._0_4_ * auVar11._0_4_;
      auVar129._4_4_ = local_3c0._4_4_ * auVar11._4_4_;
      auVar129._8_4_ = local_3c0._8_4_ * auVar11._8_4_;
      auVar129._12_4_ = local_3c0._12_4_ * auVar11._12_4_;
      auVar129._16_4_ = local_3c0._16_4_ * 0.0;
      auVar129._20_4_ = local_3c0._20_4_ * 0.0;
      auVar129._24_4_ = local_3c0._24_4_ * 0.0;
      auVar129._28_4_ = 0;
      fVar162 = local_360._0_4_;
      auVar148._0_4_ = auVar10._0_4_ * fVar162;
      fVar140 = local_360._4_4_;
      auVar148._4_4_ = auVar10._4_4_ * fVar140;
      fVar142 = local_360._8_4_;
      auVar148._8_4_ = auVar10._8_4_ * fVar142;
      fVar143 = local_360._12_4_;
      auVar148._12_4_ = auVar10._12_4_ * fVar143;
      fVar144 = local_360._16_4_;
      auVar148._16_4_ = fVar144 * 0.0;
      fVar145 = local_360._20_4_;
      auVar148._20_4_ = fVar145 * 0.0;
      fVar207 = local_360._24_4_;
      auVar148._24_4_ = fVar207 * 0.0;
      auVar148._28_4_ = 0;
      auVar23 = vsubps_avx(auVar129,auVar148);
      auVar10 = vpermilps_avx(*pauVar1,0xff);
      uVar146 = auVar10._0_8_;
      local_a0._8_8_ = uVar146;
      local_a0._0_8_ = uVar146;
      local_a0._16_8_ = uVar146;
      local_a0._24_8_ = uVar146;
      auVar11 = vpermilps_avx(*pauVar2,0xff);
      uVar146 = auVar11._0_8_;
      local_c0._8_8_ = uVar146;
      local_c0._0_8_ = uVar146;
      local_c0._16_8_ = uVar146;
      local_c0._24_8_ = uVar146;
      auVar11 = vpermilps_avx(*pauVar3,0xff);
      uVar146 = auVar11._0_8_;
      local_e0._8_8_ = uVar146;
      local_e0._0_8_ = uVar146;
      local_e0._16_8_ = uVar146;
      local_e0._24_8_ = uVar146;
      auVar27._12_4_ = fStack_734;
      auVar27._0_12_ = *pauVar4;
      auVar11 = vpermilps_avx(auVar27,0xff);
      local_100 = auVar11._0_8_;
      fVar161 = auVar11._0_4_;
      fVar141 = auVar11._4_4_;
      auVar31._4_4_ = fVar90 * fVar141;
      auVar31._0_4_ = fVar229 * fVar161;
      auVar31._8_4_ = fVar91 * fVar161;
      auVar31._12_4_ = fVar92 * fVar141;
      auVar31._16_4_ = fVar93 * fVar161;
      auVar31._20_4_ = fVar94 * fVar141;
      auVar31._24_4_ = fVar95 * fVar161;
      auVar31._28_4_ = fStack_5fc;
      auVar11 = vfmadd231ps_fma(auVar31,local_e0,auVar198);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,local_c0);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar152,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar32._4_4_ = fVar97 * fVar141;
      auVar32._0_4_ = fVar96 * fVar161;
      auVar32._8_4_ = fVar98 * fVar161;
      auVar32._12_4_ = fVar99 * fVar141;
      auVar32._16_4_ = fVar100 * fVar161;
      auVar32._20_4_ = fVar101 * fVar141;
      auVar32._24_4_ = fVar102 * fVar161;
      auVar32._28_4_ = fVar141;
      auVar12 = vfmadd231ps_fma(auVar32,auVar174,local_e0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar209,local_c0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar21,local_a0);
      auVar200 = ZEXT1664(auVar12);
      auVar33._4_4_ = fVar140 * fVar140;
      auVar33._0_4_ = fVar162 * fVar162;
      auVar33._8_4_ = fVar142 * fVar142;
      auVar33._12_4_ = fVar143 * fVar143;
      auVar33._16_4_ = fVar144 * fVar144;
      auVar33._20_4_ = fVar145 * fVar145;
      auVar33._24_4_ = fVar207 * fVar207;
      auVar33._28_4_ = auVar10._4_4_;
      auVar10 = vfmadd231ps_fma(auVar33,local_3c0,local_3c0);
      local_7c0 = ZEXT1632(auVar11);
      auVar22 = vmaxps_avx(local_7c0,ZEXT1632(auVar12));
      auVar34._4_4_ = auVar22._4_4_ * auVar22._4_4_ * auVar10._4_4_;
      auVar34._0_4_ = auVar22._0_4_ * auVar22._0_4_ * auVar10._0_4_;
      auVar34._8_4_ = auVar22._8_4_ * auVar22._8_4_ * auVar10._8_4_;
      auVar34._12_4_ = auVar22._12_4_ * auVar22._12_4_ * auVar10._12_4_;
      auVar34._16_4_ = auVar22._16_4_ * auVar22._16_4_ * 0.0;
      auVar34._20_4_ = auVar22._20_4_ * auVar22._20_4_ * 0.0;
      auVar34._24_4_ = auVar22._24_4_ * auVar22._24_4_ * 0.0;
      auVar34._28_4_ = auVar22._28_4_;
      auVar35._4_4_ = auVar23._4_4_ * auVar23._4_4_;
      auVar35._0_4_ = auVar23._0_4_ * auVar23._0_4_;
      auVar35._8_4_ = auVar23._8_4_ * auVar23._8_4_;
      auVar35._12_4_ = auVar23._12_4_ * auVar23._12_4_;
      auVar35._16_4_ = auVar23._16_4_ * auVar23._16_4_;
      auVar35._20_4_ = auVar23._20_4_ * auVar23._20_4_;
      auVar35._24_4_ = auVar23._24_4_ * auVar23._24_4_;
      auVar35._28_4_ = auVar23._28_4_;
      auVar22 = vcmpps_avx(auVar35,auVar34,2);
      auVar130._0_4_ = (float)iVar18;
      local_4c0._4_12_ = auVar16._4_12_;
      local_4c0._0_4_ = auVar130._0_4_;
      fVar162 = auVar20._0_4_ * 4.7683716e-07;
      local_4c0._16_16_ = auVar136._16_16_;
      auVar130._4_4_ = auVar130._0_4_;
      auVar130._8_4_ = auVar130._0_4_;
      auVar130._12_4_ = auVar130._0_4_;
      auVar130._16_4_ = auVar130._0_4_;
      auVar130._20_4_ = auVar130._0_4_;
      auVar130._24_4_ = auVar130._0_4_;
      auVar130._28_4_ = auVar130._0_4_;
      auVar136 = vcmpps_avx(_DAT_01faff40,auVar130,1);
      auVar20 = vpermilps_avx(auVar196,0xaa);
      uVar146 = auVar20._0_8_;
      local_520._8_8_ = uVar146;
      local_520._0_8_ = uVar146;
      local_520._16_8_ = uVar146;
      local_520._24_8_ = uVar146;
      auVar20 = vpermilps_avx(auVar14,0xaa);
      local_4e0 = auVar20._0_8_;
      uStack_4d8 = local_4e0;
      uStack_4d0 = local_4e0;
      uStack_4c8 = local_4e0;
      auVar20 = vpermilps_avx(auVar15,0xaa);
      uVar146 = auVar20._0_8_;
      auVar206._8_8_ = uVar146;
      auVar206._0_8_ = uVar146;
      auVar206._16_8_ = uVar146;
      auVar206._24_8_ = uVar146;
      auVar20 = vshufps_avx(auVar16,auVar16,0xaa);
      uVar146 = auVar20._0_8_;
      auVar224._8_8_ = uVar146;
      auVar224._0_8_ = uVar146;
      auVar224._16_8_ = uVar146;
      auVar224._24_8_ = uVar146;
      auVar227 = ZEXT3264(auVar224);
      auVar23 = auVar136 & auVar22;
      fStack_5f8 = local_600;
      fStack_5f4 = fStack_5fc;
      fStack_5f0 = local_600;
      fStack_5ec = fStack_5fc;
      fStack_5e8 = local_600;
      fStack_5e4 = fStack_5fc;
      local_780._0_4_ = fVar162;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0x7f,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0xbf,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
      {
        auVar160 = ZEXT3264(local_620);
        auVar183 = ZEXT3264(local_580);
        auVar212 = ZEXT3264(CONCAT428(fStack_5fc,
                                      CONCAT424(local_600,
                                                CONCAT420(fStack_5fc,
                                                          CONCAT416(local_600,
                                                                    CONCAT412(fStack_5fc,
                                                                              CONCAT48(local_600,
                                                                                       uVar125))))))
                           );
        auVar222 = ZEXT3264(local_6a0);
        auVar236 = ZEXT3264(local_6c0);
      }
      else {
        local_380 = vandps_avx(auVar22,auVar136);
        fVar207 = auVar20._0_4_;
        fVar229 = auVar20._4_4_;
        auVar136._4_4_ = fVar229 * fVar97;
        auVar136._0_4_ = fVar207 * fVar96;
        auVar136._8_4_ = fVar207 * fVar98;
        auVar136._12_4_ = fVar229 * fVar99;
        auVar136._16_4_ = fVar207 * fVar100;
        auVar136._20_4_ = fVar229 * fVar101;
        auVar136._24_4_ = fVar207 * fVar102;
        auVar136._28_4_ = local_380._28_4_;
        auVar20 = vfmadd213ps_fma(auVar174,auVar206,auVar136);
        auVar112._8_8_ = local_4e0;
        auVar112._0_8_ = local_4e0;
        auVar112._16_8_ = local_4e0;
        auVar112._24_8_ = local_4e0;
        auVar20 = vfmadd213ps_fma(auVar209,auVar112,ZEXT1632(auVar20));
        auVar20 = vfmadd213ps_fma(auVar21,local_520,ZEXT1632(auVar20));
        _local_3a0 = ZEXT1632(auVar20);
        local_5e0._0_4_ = auVar115._0_4_;
        local_5e0._4_4_ = auVar115._4_4_;
        fStack_5d8 = auVar115._8_4_;
        fStack_5d4 = auVar115._12_4_;
        fStack_5d0 = auVar115._16_4_;
        fStack_5cc = auVar115._20_4_;
        fStack_5c8 = auVar115._24_4_;
        auVar36._4_4_ = fVar229 * (float)local_5e0._4_4_;
        auVar36._0_4_ = fVar207 * (float)local_5e0._0_4_;
        auVar36._8_4_ = fVar207 * fStack_5d8;
        auVar36._12_4_ = fVar229 * fStack_5d4;
        auVar36._16_4_ = fVar207 * fStack_5d0;
        auVar36._20_4_ = fVar229 * fStack_5cc;
        auVar36._24_4_ = fVar207 * fStack_5c8;
        auVar36._28_4_ = local_380._28_4_;
        auVar20 = vfmadd213ps_fma(auVar198,auVar206,auVar36);
        auVar20 = vfmadd213ps_fma(auVar134,auVar112,ZEXT1632(auVar20));
        auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar174 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        fVar161 = *(float *)(bezier_basis0 + lVar25 + 0x1f9c);
        fVar140 = *(float *)(bezier_basis0 + lVar25 + 0x1fa0);
        fVar141 = *(float *)(bezier_basis0 + lVar25 + 0x1fa4);
        fVar142 = *(float *)(bezier_basis0 + lVar25 + 0x1fa8);
        fVar143 = *(float *)(bezier_basis0 + lVar25 + 0x1fac);
        fVar144 = *(float *)(bezier_basis0 + lVar25 + 0x1fb0);
        fVar145 = *(float *)(bezier_basis0 + lVar25 + 0x1fb4);
        auVar37._4_4_ = local_460 * fVar140;
        auVar37._0_4_ = local_460 * fVar161;
        auVar37._8_4_ = local_460 * fVar141;
        auVar37._12_4_ = local_460 * fVar142;
        auVar37._16_4_ = local_460 * fVar143;
        auVar37._20_4_ = local_460 * fVar144;
        auVar37._24_4_ = local_460 * fVar145;
        auVar37._28_4_ = local_360._28_4_;
        auVar208._0_4_ = local_600 * fVar161;
        auVar208._4_4_ = fStack_5fc * fVar140;
        auVar208._8_4_ = local_600 * fVar141;
        auVar208._12_4_ = fStack_5fc * fVar142;
        auVar208._16_4_ = local_600 * fVar143;
        auVar208._20_4_ = fStack_5fc * fVar144;
        auVar208._24_4_ = local_600 * fVar145;
        auVar208._28_4_ = 0;
        auVar38._4_4_ = fVar140 * fVar229;
        auVar38._0_4_ = fVar161 * fVar207;
        auVar38._8_4_ = fVar141 * fVar207;
        auVar38._12_4_ = fVar142 * fVar229;
        auVar38._16_4_ = fVar143 * fVar207;
        auVar38._20_4_ = fVar144 * fVar229;
        auVar38._24_4_ = fVar145 * fVar207;
        auVar38._28_4_ = *(undefined4 *)(bezier_basis1 + lVar25 + 0xda8);
        auVar10 = vfmadd231ps_fma(auVar37,auVar174,local_620);
        auVar11 = vfmadd231ps_fma(auVar208,auVar174,local_580);
        auVar13 = vfmadd231ps_fma(auVar38,auVar206,auVar174);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar134,local_6a0);
        local_780._16_16_ = auVar198._16_16_;
        local_780._0_16_ = ZEXT416((uint)fVar162);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,local_4a0);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar112,auVar134);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar136,local_6c0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar136,local_480);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar136,local_520);
        fVar161 = *(float *)(bezier_basis1 + lVar25 + 0x1f9c);
        fVar140 = *(float *)(bezier_basis1 + lVar25 + 0x1fa0);
        fVar141 = *(float *)(bezier_basis1 + lVar25 + 0x1fa4);
        fVar142 = *(float *)(bezier_basis1 + lVar25 + 0x1fa8);
        fVar143 = *(float *)(bezier_basis1 + lVar25 + 0x1fac);
        fVar144 = *(float *)(bezier_basis1 + lVar25 + 0x1fb0);
        fVar145 = *(float *)(bezier_basis1 + lVar25 + 0x1fb4);
        auVar198._4_4_ = local_460 * fVar140;
        auVar198._0_4_ = local_460 * fVar161;
        auVar198._8_4_ = local_460 * fVar141;
        auVar198._12_4_ = local_460 * fVar142;
        auVar198._16_4_ = local_460 * fVar143;
        auVar198._20_4_ = local_460 * fVar144;
        auVar198._24_4_ = local_460 * fVar145;
        auVar198._28_4_ = local_460;
        auVar39._4_4_ = fStack_5fc * fVar140;
        auVar39._0_4_ = local_600 * fVar161;
        auVar39._8_4_ = local_600 * fVar141;
        auVar39._12_4_ = fStack_5fc * fVar142;
        auVar39._16_4_ = local_600 * fVar143;
        auVar39._20_4_ = fStack_5fc * fVar144;
        auVar39._24_4_ = local_600 * fVar145;
        auVar39._28_4_ = fStack_5fc;
        _local_5e0 = auVar224;
        auVar40._4_4_ = fVar229 * fVar140;
        auVar40._0_4_ = fVar207 * fVar161;
        auVar40._8_4_ = fVar207 * fVar141;
        auVar40._12_4_ = fVar229 * fVar142;
        auVar40._16_4_ = fVar207 * fVar143;
        auVar40._20_4_ = fVar229 * fVar144;
        auVar40._24_4_ = fVar207 * fVar145;
        auVar40._28_4_ = fVar229;
        auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar196 = vfmadd231ps_fma(auVar198,auVar136,local_620);
        auVar14 = vfmadd231ps_fma(auVar39,auVar136,local_580);
        local_640 = auVar206;
        auVar15 = vfmadd231ps_fma(auVar40,auVar206,auVar136);
        auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar136,local_6a0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar136,local_4a0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,auVar136);
        auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar136,local_6c0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar136,local_480);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_520,auVar136);
        auVar136 = vandps_avx(local_180,ZEXT1632(auVar10));
        auVar198 = vandps_avx(ZEXT1632(auVar11),local_180);
        auVar198 = vmaxps_avx(auVar136,auVar198);
        auVar136 = vandps_avx(ZEXT1632(auVar13),local_180);
        auVar136 = vmaxps_avx(auVar198,auVar136);
        auVar149._4_4_ = fVar162;
        auVar149._0_4_ = fVar162;
        auVar149._8_4_ = fVar162;
        auVar149._12_4_ = fVar162;
        auVar149._16_4_ = fVar162;
        auVar149._20_4_ = fVar162;
        auVar149._24_4_ = fVar162;
        auVar149._28_4_ = fVar162;
        auVar136 = vcmpps_avx(auVar136,auVar149,1);
        auVar134 = vblendvps_avx(ZEXT1632(auVar10),local_3c0,auVar136);
        auVar174 = vblendvps_avx(ZEXT1632(auVar11),_local_360,auVar136);
        auVar136 = vandps_avx(ZEXT1632(auVar196),local_180);
        auVar198 = vandps_avx(ZEXT1632(auVar14),local_180);
        auVar198 = vmaxps_avx(auVar136,auVar198);
        auVar136 = vandps_avx(ZEXT1632(auVar15),local_180);
        auVar136 = vmaxps_avx(auVar198,auVar136);
        auVar198 = vcmpps_avx(auVar136,auVar149,1);
        auVar136 = vblendvps_avx(ZEXT1632(auVar196),local_3c0,auVar198);
        auVar198 = vblendvps_avx(ZEXT1632(auVar14),_local_360,auVar198);
        auVar20 = vfmadd213ps_fma(auVar152,local_520,ZEXT1632(auVar20));
        fVar207 = -auVar136._4_4_;
        auVar10 = vfmadd213ps_fma(auVar134,auVar134,ZEXT832(0) << 0x20);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar174,auVar174);
        auVar209 = vrsqrtps_avx(ZEXT1632(auVar10));
        fVar161 = auVar209._0_4_;
        fVar140 = auVar209._4_4_;
        fVar141 = auVar209._8_4_;
        fVar142 = auVar209._12_4_;
        fVar143 = auVar209._16_4_;
        fVar144 = auVar209._20_4_;
        fVar145 = auVar209._24_4_;
        auVar41._4_4_ = fVar140 * fVar140 * fVar140 * auVar10._4_4_ * -0.5;
        auVar41._0_4_ = fVar161 * fVar161 * fVar161 * auVar10._0_4_ * -0.5;
        auVar41._8_4_ = fVar141 * fVar141 * fVar141 * auVar10._8_4_ * -0.5;
        auVar41._12_4_ = fVar142 * fVar142 * fVar142 * auVar10._12_4_ * -0.5;
        auVar41._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar41._20_4_ = fVar144 * fVar144 * fVar144 * -0.0;
        auVar41._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
        auVar41._28_4_ = 0;
        auVar231._8_4_ = 0x3fc00000;
        auVar231._0_8_ = 0x3fc000003fc00000;
        auVar231._12_4_ = 0x3fc00000;
        auVar231._16_4_ = 0x3fc00000;
        auVar231._20_4_ = 0x3fc00000;
        auVar231._24_4_ = 0x3fc00000;
        auVar231._28_4_ = 0x3fc00000;
        auVar10 = vfmadd231ps_fma(auVar41,auVar231,auVar209);
        fVar161 = auVar10._0_4_;
        fVar140 = auVar10._4_4_;
        auVar42._4_4_ = auVar174._4_4_ * fVar140;
        auVar42._0_4_ = auVar174._0_4_ * fVar161;
        fVar141 = auVar10._8_4_;
        auVar42._8_4_ = auVar174._8_4_ * fVar141;
        fVar142 = auVar10._12_4_;
        auVar42._12_4_ = auVar174._12_4_ * fVar142;
        auVar42._16_4_ = auVar174._16_4_ * 0.0;
        auVar42._20_4_ = auVar174._20_4_ * 0.0;
        auVar42._24_4_ = auVar174._24_4_ * 0.0;
        auVar42._28_4_ = auVar209._28_4_;
        auVar43._4_4_ = -auVar134._4_4_ * fVar140;
        auVar43._0_4_ = -auVar134._0_4_ * fVar161;
        auVar43._8_4_ = -auVar134._8_4_ * fVar141;
        auVar43._12_4_ = -auVar134._12_4_ * fVar142;
        auVar43._16_4_ = -auVar134._16_4_ * 0.0;
        auVar43._20_4_ = -auVar134._20_4_ * 0.0;
        auVar43._24_4_ = -auVar134._24_4_ * 0.0;
        auVar43._28_4_ = 0;
        auVar10 = vfmadd213ps_fma(auVar136,auVar136,ZEXT832(0) << 0x20);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar198,auVar198);
        auVar134 = vrsqrtps_avx(ZEXT1632(auVar10));
        auVar174 = ZEXT1632(CONCAT412(fVar142 * 0.0,
                                      CONCAT48(fVar141 * 0.0,CONCAT44(fVar140 * 0.0,fVar161 * 0.0)))
                           );
        fVar161 = auVar134._0_4_;
        fVar140 = auVar134._4_4_;
        fVar141 = auVar134._8_4_;
        fVar142 = auVar134._12_4_;
        fVar143 = auVar134._16_4_;
        fVar144 = auVar134._20_4_;
        fVar145 = auVar134._24_4_;
        auVar44._4_4_ = fVar140 * fVar140 * fVar140 * auVar10._4_4_ * -0.5;
        auVar44._0_4_ = fVar161 * fVar161 * fVar161 * auVar10._0_4_ * -0.5;
        auVar44._8_4_ = fVar141 * fVar141 * fVar141 * auVar10._8_4_ * -0.5;
        auVar44._12_4_ = fVar142 * fVar142 * fVar142 * auVar10._12_4_ * -0.5;
        auVar44._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar44._20_4_ = fVar144 * fVar144 * fVar144 * -0.0;
        auVar44._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
        auVar44._28_4_ = 0xbf000000;
        auVar10 = vfmadd231ps_fma(auVar44,auVar231,auVar134);
        fVar161 = auVar10._0_4_;
        fVar140 = auVar10._4_4_;
        auVar45._4_4_ = fVar140 * auVar198._4_4_;
        auVar45._0_4_ = fVar161 * auVar198._0_4_;
        fVar141 = auVar10._8_4_;
        auVar45._8_4_ = fVar141 * auVar198._8_4_;
        fVar142 = auVar10._12_4_;
        auVar45._12_4_ = fVar142 * auVar198._12_4_;
        auVar45._16_4_ = auVar198._16_4_ * 0.0;
        auVar45._20_4_ = auVar198._20_4_ * 0.0;
        auVar45._24_4_ = auVar198._24_4_ * 0.0;
        auVar45._28_4_ = 0;
        auVar46._4_4_ = fVar140 * fVar207;
        auVar46._0_4_ = fVar161 * -auVar136._0_4_;
        auVar46._8_4_ = fVar141 * -auVar136._8_4_;
        auVar46._12_4_ = fVar142 * -auVar136._12_4_;
        auVar46._16_4_ = -auVar136._16_4_ * 0.0;
        auVar46._20_4_ = -auVar136._20_4_ * 0.0;
        auVar46._24_4_ = -auVar136._24_4_ * 0.0;
        auVar46._28_4_ = 0x3fc00000;
        auVar47._28_4_ = auVar134._28_4_;
        auVar47._0_28_ =
             ZEXT1628(CONCAT412(fVar142 * 0.0,
                                CONCAT48(fVar141 * 0.0,CONCAT44(fVar140 * 0.0,fVar161 * 0.0))));
        auVar10 = vfmadd213ps_fma(auVar42,local_7c0,local_340);
        auVar11 = vfmadd213ps_fma(auVar43,local_7c0,auVar128);
        auVar13 = vfmadd213ps_fma(auVar174,local_7c0,ZEXT1632(auVar20));
        auVar16 = vfnmadd213ps_fma(auVar42,local_7c0,local_340);
        auVar196 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar12),local_300);
        auVar126 = vfnmadd213ps_fma(auVar43,local_7c0,auVar128);
        auVar198 = ZEXT1632(auVar12);
        auVar14 = vfmadd213ps_fma(auVar46,auVar198,local_320);
        auVar27 = vfnmadd231ps_fma(ZEXT1632(auVar20),local_7c0,auVar174);
        auVar15 = vfmadd213ps_fma(auVar47,auVar198,_local_3a0);
        auVar202 = vfnmadd213ps_fma(auVar45,auVar198,local_300);
        auVar26 = vfnmadd213ps_fma(auVar46,auVar198,local_320);
        local_500 = ZEXT1632(auVar12);
        auVar28 = vfnmadd231ps_fma(_local_3a0,local_500,auVar47);
        auVar198 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar126));
        auVar134 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar27));
        auVar171._0_4_ = auVar27._0_4_ * auVar198._0_4_;
        auVar171._4_4_ = auVar27._4_4_ * auVar198._4_4_;
        auVar171._8_4_ = auVar27._8_4_ * auVar198._8_4_;
        auVar171._12_4_ = auVar27._12_4_ * auVar198._12_4_;
        auVar171._16_4_ = auVar198._16_4_ * 0.0;
        auVar171._20_4_ = auVar198._20_4_ * 0.0;
        auVar171._24_4_ = auVar198._24_4_ * 0.0;
        auVar171._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar171,ZEXT1632(auVar126),auVar134);
        auVar48._4_4_ = auVar16._4_4_ * auVar134._4_4_;
        auVar48._0_4_ = auVar16._0_4_ * auVar134._0_4_;
        auVar48._8_4_ = auVar16._8_4_ * auVar134._8_4_;
        auVar48._12_4_ = auVar16._12_4_ * auVar134._12_4_;
        auVar48._16_4_ = auVar134._16_4_ * 0.0;
        auVar48._20_4_ = auVar134._20_4_ * 0.0;
        auVar48._24_4_ = auVar134._24_4_ * 0.0;
        auVar48._28_4_ = auVar134._28_4_;
        auVar209 = ZEXT1632(auVar16);
        auVar134 = vsubps_avx(ZEXT1632(auVar196),auVar209);
        auVar20 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar27),auVar134);
        auVar49._4_4_ = auVar126._4_4_ * auVar134._4_4_;
        auVar49._0_4_ = auVar126._0_4_ * auVar134._0_4_;
        auVar49._8_4_ = auVar126._8_4_ * auVar134._8_4_;
        auVar49._12_4_ = auVar126._12_4_ * auVar134._12_4_;
        auVar49._16_4_ = auVar134._16_4_ * 0.0;
        auVar49._20_4_ = auVar134._20_4_ * 0.0;
        auVar49._24_4_ = auVar134._24_4_ * 0.0;
        auVar49._28_4_ = auVar134._28_4_;
        auVar16 = vfmsub231ps_fma(auVar49,auVar209,auVar198);
        auVar89._4_8_ = 0;
        auVar89._0_4_ = (uint)-auVar136._4_4_ ^ (uint)fVar207;
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1232(auVar89) << 0x20,ZEXT1632(auVar20));
        local_5a0._16_16_ = auVar152._16_16_;
        local_5a0._0_16_ = local_380._16_16_;
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT1232(auVar89) << 0x20,ZEXT1632(auVar12));
        auVar23 = vcmpps_avx(ZEXT1632(auVar20),ZEXT1232(auVar89) << 0x20,2);
        local_7a0 = vblendvps_avx(ZEXT1632(auVar202),ZEXT1632(auVar10),auVar23);
        auVar136 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar11),auVar23);
        auVar198 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar13),auVar23);
        auVar200 = ZEXT3264(auVar198);
        auVar134 = vblendvps_avx(auVar209,ZEXT1632(auVar196),auVar23);
        auVar152 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar14),auVar23);
        auVar174 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar15),auVar23);
        auVar209 = vblendvps_avx(ZEXT1632(auVar196),auVar209,auVar23);
        auVar21 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar126),auVar23);
        auVar20 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
        auVar22 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar27),auVar23);
        auVar128 = vsubps_avx(auVar209,local_7a0);
        auVar21 = vsubps_avx(auVar21,auVar136);
        auVar155 = vsubps_avx(auVar22,auVar198);
        auVar147 = vsubps_avx(local_7a0,auVar134);
        auVar173 = vsubps_avx(auVar136,auVar152);
        auVar137 = vsubps_avx(auVar198,auVar174);
        auVar50._4_4_ = auVar155._4_4_ * local_7a0._4_4_;
        auVar50._0_4_ = auVar155._0_4_ * local_7a0._0_4_;
        auVar50._8_4_ = auVar155._8_4_ * local_7a0._8_4_;
        auVar50._12_4_ = auVar155._12_4_ * local_7a0._12_4_;
        auVar50._16_4_ = auVar155._16_4_ * local_7a0._16_4_;
        auVar50._20_4_ = auVar155._20_4_ * local_7a0._20_4_;
        auVar50._24_4_ = auVar155._24_4_ * local_7a0._24_4_;
        auVar50._28_4_ = auVar22._28_4_;
        auVar10 = vfmsub231ps_fma(auVar50,auVar198,auVar128);
        auVar51._4_4_ = auVar128._4_4_ * auVar136._4_4_;
        auVar51._0_4_ = auVar128._0_4_ * auVar136._0_4_;
        auVar51._8_4_ = auVar128._8_4_ * auVar136._8_4_;
        auVar51._12_4_ = auVar128._12_4_ * auVar136._12_4_;
        auVar51._16_4_ = auVar128._16_4_ * auVar136._16_4_;
        auVar51._20_4_ = auVar128._20_4_ * auVar136._20_4_;
        auVar51._24_4_ = auVar128._24_4_ * auVar136._24_4_;
        auVar51._28_4_ = auVar209._28_4_;
        auVar11 = vfmsub231ps_fma(auVar51,local_7a0,auVar21);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar131._0_4_ = auVar21._0_4_ * auVar198._0_4_;
        auVar131._4_4_ = auVar21._4_4_ * auVar198._4_4_;
        auVar131._8_4_ = auVar21._8_4_ * auVar198._8_4_;
        auVar131._12_4_ = auVar21._12_4_ * auVar198._12_4_;
        auVar131._16_4_ = auVar21._16_4_ * auVar198._16_4_;
        auVar131._20_4_ = auVar21._20_4_ * auVar198._20_4_;
        auVar131._24_4_ = auVar21._24_4_ * auVar198._24_4_;
        auVar131._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar131,auVar136,auVar155);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar132._0_4_ = auVar137._0_4_ * auVar134._0_4_;
        auVar132._4_4_ = auVar137._4_4_ * auVar134._4_4_;
        auVar132._8_4_ = auVar137._8_4_ * auVar134._8_4_;
        auVar132._12_4_ = auVar137._12_4_ * auVar134._12_4_;
        auVar132._16_4_ = auVar137._16_4_ * auVar134._16_4_;
        auVar132._20_4_ = auVar137._20_4_ * auVar134._20_4_;
        auVar132._24_4_ = auVar137._24_4_ * auVar134._24_4_;
        auVar132._28_4_ = 0;
        auVar10 = vfmsub231ps_fma(auVar132,auVar147,auVar174);
        auVar52._4_4_ = auVar173._4_4_ * auVar174._4_4_;
        auVar52._0_4_ = auVar173._0_4_ * auVar174._0_4_;
        auVar52._8_4_ = auVar173._8_4_ * auVar174._8_4_;
        auVar52._12_4_ = auVar173._12_4_ * auVar174._12_4_;
        auVar52._16_4_ = auVar173._16_4_ * auVar174._16_4_;
        auVar52._20_4_ = auVar173._20_4_ * auVar174._20_4_;
        auVar52._24_4_ = auVar173._24_4_ * auVar174._24_4_;
        auVar52._28_4_ = auVar174._28_4_;
        auVar12 = vfmsub231ps_fma(auVar52,auVar152,auVar137);
        auVar53._4_4_ = auVar147._4_4_ * auVar152._4_4_;
        auVar53._0_4_ = auVar147._0_4_ * auVar152._0_4_;
        auVar53._8_4_ = auVar147._8_4_ * auVar152._8_4_;
        auVar53._12_4_ = auVar147._12_4_ * auVar152._12_4_;
        auVar53._16_4_ = auVar147._16_4_ * auVar152._16_4_;
        auVar53._20_4_ = auVar147._20_4_ * auVar152._20_4_;
        auVar53._24_4_ = auVar147._24_4_ * auVar152._24_4_;
        auVar53._28_4_ = auVar152._28_4_;
        auVar13 = vfmsub231ps_fma(auVar53,auVar173,auVar134);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar134 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
        auVar134 = vcmpps_avx(auVar134,ZEXT832(0) << 0x20,2);
        auVar10 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
        auVar20 = vpand_avx(auVar20,auVar10);
        auVar134 = vpmovsxwd_avx2(auVar20);
        if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0x7f,0) == '\0') &&
              (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar134 >> 0xbf,0) == '\0') &&
            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar134[0x1f]) {
LAB_018168ea:
          auVar185._8_8_ = local_560[1]._8_8_;
          auVar185._0_8_ = local_560[1]._0_8_;
          auVar185._16_8_ = local_560[1]._16_8_;
          auVar185._24_8_ = local_560[1]._24_8_;
          auVar221._8_4_ = local_600;
          auVar221._0_8_ = uVar125;
          auVar221._12_4_ = fStack_5fc;
          auVar221._16_4_ = local_600;
          auVar221._20_4_ = fStack_5fc;
          auVar221._24_4_ = local_600;
          auVar221._28_4_ = fStack_5fc;
        }
        else {
          auVar54._4_4_ = auVar21._4_4_ * auVar137._4_4_;
          auVar54._0_4_ = auVar21._0_4_ * auVar137._0_4_;
          auVar54._8_4_ = auVar21._8_4_ * auVar137._8_4_;
          auVar54._12_4_ = auVar21._12_4_ * auVar137._12_4_;
          auVar54._16_4_ = auVar21._16_4_ * auVar137._16_4_;
          auVar54._20_4_ = auVar21._20_4_ * auVar137._20_4_;
          auVar54._24_4_ = auVar21._24_4_ * auVar137._24_4_;
          auVar54._28_4_ = auVar134._28_4_;
          auVar14 = vfmsub231ps_fma(auVar54,auVar173,auVar155);
          auVar150._0_4_ = auVar147._0_4_ * auVar155._0_4_;
          auVar150._4_4_ = auVar147._4_4_ * auVar155._4_4_;
          auVar150._8_4_ = auVar147._8_4_ * auVar155._8_4_;
          auVar150._12_4_ = auVar147._12_4_ * auVar155._12_4_;
          auVar150._16_4_ = auVar147._16_4_ * auVar155._16_4_;
          auVar150._20_4_ = auVar147._20_4_ * auVar155._20_4_;
          auVar150._24_4_ = auVar147._24_4_ * auVar155._24_4_;
          auVar150._28_4_ = 0;
          auVar196 = vfmsub231ps_fma(auVar150,auVar128,auVar137);
          auVar55._4_4_ = auVar128._4_4_ * auVar173._4_4_;
          auVar55._0_4_ = auVar128._0_4_ * auVar173._0_4_;
          auVar55._8_4_ = auVar128._8_4_ * auVar173._8_4_;
          auVar55._12_4_ = auVar128._12_4_ * auVar173._12_4_;
          auVar55._16_4_ = auVar128._16_4_ * auVar173._16_4_;
          auVar55._20_4_ = auVar128._20_4_ * auVar173._20_4_;
          auVar55._24_4_ = auVar128._24_4_ * auVar173._24_4_;
          auVar55._28_4_ = auVar128._28_4_;
          auVar15 = vfmsub231ps_fma(auVar55,auVar147,auVar21);
          auVar10 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar196),ZEXT1632(auVar15));
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar14),_DAT_01faff00);
          auVar134 = vrcpps_avx(ZEXT1632(auVar13));
          auVar220._8_4_ = 0x3f800000;
          auVar220._0_8_ = 0x3f8000003f800000;
          auVar220._12_4_ = 0x3f800000;
          auVar220._16_4_ = 0x3f800000;
          auVar220._20_4_ = 0x3f800000;
          auVar220._24_4_ = 0x3f800000;
          auVar220._28_4_ = 0x3f800000;
          auVar10 = vfnmadd213ps_fma(auVar134,ZEXT1632(auVar13),auVar220);
          auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar134,auVar134);
          auVar56._4_4_ = auVar15._4_4_ * auVar198._4_4_;
          auVar56._0_4_ = auVar15._0_4_ * auVar198._0_4_;
          auVar56._8_4_ = auVar15._8_4_ * auVar198._8_4_;
          auVar56._12_4_ = auVar15._12_4_ * auVar198._12_4_;
          auVar56._16_4_ = auVar198._16_4_ * 0.0;
          auVar56._20_4_ = auVar198._20_4_ * 0.0;
          auVar56._24_4_ = auVar198._24_4_ * 0.0;
          auVar56._28_4_ = auVar198._28_4_;
          auVar196 = vfmadd231ps_fma(auVar56,auVar136,ZEXT1632(auVar196));
          auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),ZEXT1632(auVar14),local_7a0);
          auVar200 = ZEXT1664(auVar196);
          fVar140 = auVar10._0_4_;
          fVar141 = auVar10._4_4_;
          fVar142 = auVar10._8_4_;
          fVar143 = auVar10._12_4_;
          auVar57._28_4_ = auVar136._28_4_;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar143 * auVar196._12_4_,
                                  CONCAT48(fVar142 * auVar196._8_4_,
                                           CONCAT44(fVar141 * auVar196._4_4_,
                                                    fVar140 * auVar196._0_4_))));
          auVar10 = vpermilps_avx((undefined1  [16])aVar7,0xff);
          auVar133._0_8_ = auVar10._0_8_;
          auVar133._8_8_ = auVar133._0_8_;
          auVar133._16_8_ = auVar133._0_8_;
          auVar133._24_8_ = auVar133._0_8_;
          fVar161 = (ray->super_RayK<1>).tfar;
          auVar151._4_4_ = fVar161;
          auVar151._0_4_ = fVar161;
          auVar151._8_4_ = fVar161;
          auVar151._12_4_ = fVar161;
          auVar151._16_4_ = fVar161;
          auVar151._20_4_ = fVar161;
          auVar151._24_4_ = fVar161;
          auVar151._28_4_ = fVar161;
          auVar136 = vcmpps_avx(auVar133,auVar57,2);
          auVar198 = vcmpps_avx(auVar57,auVar151,2);
          auVar136 = vandps_avx(auVar198,auVar136);
          auVar10 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
          auVar20 = vpand_avx(auVar20,auVar10);
          auVar136 = vpmovsxwd_avx2(auVar20);
          if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar136 >> 0x7f,0) == '\0') &&
                (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar136 >> 0xbf,0) == '\0') &&
              (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar136[0x1f]) goto LAB_018168ea;
          auVar136 = vcmpps_avx(ZEXT1632(auVar13),ZEXT832(0) << 0x20,4);
          auVar10 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
          auVar20 = vpand_avx(auVar20,auVar10);
          auVar136 = vpmovsxwd_avx2(auVar20);
          auVar200 = ZEXT3264(auVar136);
          auVar185._8_8_ = local_560[1]._8_8_;
          auVar185._0_8_ = local_560[1]._0_8_;
          auVar185._16_8_ = local_560[1]._16_8_;
          auVar185._24_8_ = local_560[1]._24_8_;
          auVar221._8_4_ = local_600;
          auVar221._0_8_ = uVar125;
          auVar221._12_4_ = fStack_5fc;
          auVar221._16_4_ = local_600;
          auVar221._20_4_ = fStack_5fc;
          auVar221._24_4_ = local_600;
          auVar221._28_4_ = fStack_5fc;
          if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar136 >> 0x7f,0) != '\0') ||
                (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar136 >> 0xbf,0) != '\0') ||
              (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar136[0x1f] < '\0') {
            auVar134 = ZEXT1632(CONCAT412(fVar143 * auVar11._12_4_,
                                          CONCAT48(fVar142 * auVar11._8_4_,
                                                   CONCAT44(fVar141 * auVar11._4_4_,
                                                            fVar140 * auVar11._0_4_))));
            auVar152 = ZEXT1632(CONCAT412(fVar143 * auVar12._12_4_,
                                          CONCAT48(fVar142 * auVar12._8_4_,
                                                   CONCAT44(fVar141 * auVar12._4_4_,
                                                            fVar140 * auVar12._0_4_))));
            auVar184._8_4_ = 0x3f800000;
            auVar184._0_8_ = 0x3f8000003f800000;
            auVar184._12_4_ = 0x3f800000;
            auVar184._16_4_ = 0x3f800000;
            auVar184._20_4_ = 0x3f800000;
            auVar184._24_4_ = 0x3f800000;
            auVar184._28_4_ = 0x3f800000;
            auVar198 = vsubps_avx(auVar184,auVar134);
            _local_160 = vblendvps_avx(auVar198,auVar134,auVar23);
            auVar198 = vsubps_avx(auVar184,auVar152);
            local_400 = vblendvps_avx(auVar198,auVar152,auVar23);
            local_3e0 = auVar57;
            auVar185 = auVar136;
          }
        }
        auVar236 = ZEXT3264(local_6c0);
        auVar227 = ZEXT3264(auVar224);
        if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar185 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar185 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar185 >> 0x7f,0) != '\0') ||
              (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar185 >> 0xbf,0) != '\0') ||
            (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar185[0x1f] < '\0') {
          auVar136 = vsubps_avx(local_500,local_7c0);
          auVar20 = vfmadd213ps_fma(auVar136,_local_160,local_7c0);
          fVar161 = pre->depth_scale;
          auVar58._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar161;
          auVar58._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar161;
          auVar58._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar161;
          auVar58._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar161;
          auVar58._16_4_ = fVar161 * 0.0;
          auVar58._20_4_ = fVar161 * 0.0;
          auVar58._24_4_ = fVar161 * 0.0;
          auVar58._28_4_ = 0;
          auVar200 = ZEXT3264(local_3e0);
          auVar136 = vcmpps_avx(local_3e0,auVar58,6);
          auVar198 = auVar185 & auVar136;
          auVar212 = ZEXT3264(auVar221);
          if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar198 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar198 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar198 >> 0x7f,0) != '\0') ||
                (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar198 >> 0xbf,0) != '\0') ||
              (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar198[0x1f] < '\0') {
            auVar153._8_4_ = 0xbf800000;
            auVar153._0_8_ = 0xbf800000bf800000;
            auVar153._12_4_ = 0xbf800000;
            auVar153._16_4_ = 0xbf800000;
            auVar153._20_4_ = 0xbf800000;
            auVar153._24_4_ = 0xbf800000;
            auVar153._28_4_ = 0xbf800000;
            auVar172._8_4_ = 0x40000000;
            auVar172._0_8_ = 0x4000000040000000;
            auVar172._12_4_ = 0x40000000;
            auVar172._16_4_ = 0x40000000;
            auVar172._20_4_ = 0x40000000;
            auVar172._24_4_ = 0x40000000;
            auVar172._28_4_ = 0x40000000;
            auVar20 = vfmadd213ps_fma(local_400,auVar172,auVar153);
            local_2c0 = _local_160;
            local_400 = ZEXT1632(auVar20);
            auVar198 = local_400;
            local_2a0 = ZEXT1632(auVar20);
            local_280 = local_3e0;
            local_260 = 0;
            local_25c = iVar18;
            local_250 = *(undefined8 *)*pauVar1;
            uStack_248 = *(undefined8 *)(*pauVar1 + 8);
            local_240 = *(undefined8 *)*pauVar2;
            uStack_238 = *(undefined8 *)(*pauVar2 + 8);
            local_230 = *(undefined8 *)*pauVar3;
            uStack_228 = *(undefined8 *)(*pauVar3 + 8);
            auVar222 = ZEXT3264(local_6a0);
            auVar160 = ZEXT3264(auVar206);
            local_400 = auVar198;
            if ((pGVar121->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar136 = vandps_avx(auVar136,auVar185);
              local_560[0] = auVar136;
              fVar161 = 1.0 / auVar130._0_4_;
              local_1e0[0] = fVar161 * ((float)local_160._0_4_ + 0.0);
              local_1e0[1] = fVar161 * ((float)local_160._4_4_ + 1.0);
              local_1e0[2] = fVar161 * (fStack_158 + 2.0);
              local_1e0[3] = fVar161 * (fStack_154 + 3.0);
              fStack_1d0 = fVar161 * (fStack_150 + 4.0);
              fStack_1cc = fVar161 * (fStack_14c + 5.0);
              fStack_1c8 = fVar161 * (fStack_148 + 6.0);
              fStack_1c4 = fStack_144 + 7.0;
              local_400._0_8_ = auVar20._0_8_;
              local_400._8_8_ = auVar20._8_8_;
              local_1c0 = local_400._0_8_;
              uStack_1b8 = local_400._8_8_;
              uStack_1b0 = 0;
              uStack_1a8 = 0;
              local_1a0 = local_3e0;
              auVar154._8_4_ = 0x7f800000;
              auVar154._0_8_ = 0x7f8000007f800000;
              auVar154._12_4_ = 0x7f800000;
              auVar154._16_4_ = 0x7f800000;
              auVar154._20_4_ = 0x7f800000;
              auVar154._24_4_ = 0x7f800000;
              auVar154._28_4_ = 0x7f800000;
              auVar198 = vblendvps_avx(auVar154,local_3e0,auVar136);
              auVar134 = vshufps_avx(auVar198,auVar198,0xb1);
              auVar134 = vminps_avx(auVar198,auVar134);
              auVar152 = vshufpd_avx(auVar134,auVar134,5);
              auVar134 = vminps_avx(auVar134,auVar152);
              auVar152 = vpermpd_avx2(auVar134,0x4e);
              auVar134 = vminps_avx(auVar134,auVar152);
              auVar198 = vcmpps_avx(auVar198,auVar134,0);
              auVar134 = auVar136 & auVar198;
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0x7f,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0xbf,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar134[0x1f] < '\0') {
                auVar136 = vandps_avx(auVar198,auVar136);
              }
              uVar117 = vmovmskps_avx(auVar136);
              uVar24 = 0;
              for (; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x80000000) {
                uVar24 = uVar24 + 1;
              }
              uVar119 = (ulong)uVar24;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar121->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_7c0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                do {
                  local_664 = local_1e0[uVar119];
                  local_660 = *(undefined4 *)((long)&local_1c0 + uVar119 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar119 * 4);
                  local_6f0.context = context->user;
                  fVar161 = 1.0 - local_664;
                  fVar162 = fVar161 * fVar161 * -3.0;
                  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),
                                            ZEXT416((uint)(local_664 * fVar161)),ZEXT416(0xc0000000)
                                           );
                  auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_664 * fVar161)),
                                            ZEXT416((uint)(local_664 * local_664)),
                                            ZEXT416(0x40000000));
                  auVar200 = ZEXT464(0x40400000);
                  fVar161 = auVar20._0_4_ * 3.0;
                  fVar140 = auVar10._0_4_ * 3.0;
                  fVar141 = local_664 * local_664 * 3.0;
                  auVar191._0_4_ = fVar141 * local_740;
                  auVar191._4_4_ = fVar141 * fStack_73c;
                  auVar191._8_4_ = fVar141 * fStack_738;
                  auVar191._12_4_ = fVar141 * fStack_734;
                  auVar169._4_4_ = fVar140;
                  auVar169._0_4_ = fVar140;
                  auVar169._8_4_ = fVar140;
                  auVar169._12_4_ = fVar140;
                  auVar105._8_8_ = uStack_728;
                  auVar105._0_8_ = local_730;
                  auVar20 = vfmadd132ps_fma(auVar169,auVar191,auVar105);
                  auVar180._4_4_ = fVar161;
                  auVar180._0_4_ = fVar161;
                  auVar180._8_4_ = fVar161;
                  auVar180._12_4_ = fVar161;
                  auVar108._8_8_ = uStack_718;
                  auVar108._0_8_ = local_720;
                  auVar20 = vfmadd132ps_fma(auVar180,auVar20,auVar108);
                  auVar170._4_4_ = fVar162;
                  auVar170._0_4_ = fVar162;
                  auVar170._8_4_ = fVar162;
                  auVar170._12_4_ = fVar162;
                  auVar111._8_8_ = uStack_708;
                  auVar111._0_8_ = local_710;
                  auVar20 = vfmadd132ps_fma(auVar170,auVar20,auVar111);
                  local_670 = vmovlps_avx(auVar20);
                  local_668 = vextractps_avx(auVar20,2);
                  local_65c = (int)local_748;
                  local_658 = (int)local_7c8;
                  local_654 = (local_6f0.context)->instID[0];
                  local_650 = (local_6f0.context)->instPrimID[0];
                  local_7cc = -1;
                  local_6f0.valid = &local_7cc;
                  local_6f0.geometryUserPtr = pGVar121->userPtr;
                  local_6f0.ray = (RTCRayN *)ray;
                  local_6f0.hit = (RTCHitN *)&local_670;
                  local_6f0.N = 1;
                  local_7a0._0_8_ = uVar119;
                  if (pGVar121->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01816b08:
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar121->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar200 = ZEXT1664(auVar200._0_16_);
                      (*p_Var19)(&local_6f0);
                      auVar227 = ZEXT3264(_local_5e0);
                      auVar160 = ZEXT3264(local_640);
                      auVar236 = ZEXT3264(local_6c0);
                      auVar222 = ZEXT3264(local_6a0);
                      auVar212 = ZEXT3264(CONCAT428(fStack_5e4,
                                                    CONCAT424(fStack_5e8,
                                                              CONCAT420(fStack_5ec,
                                                                        CONCAT416(fStack_5f0,
                                                                                  CONCAT412(
                                                  fStack_5f4,
                                                  CONCAT48(fStack_5f8,CONCAT44(fStack_5fc,local_600)
                                                          )))))));
                      pre = local_6f8;
                      uVar119 = local_7a0._0_8_;
                      if (*local_6f0.valid == 0) goto LAB_01816bef;
                    }
                    (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_6f0.hit;
                    (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_6f0.hit + 4);
                    (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_6f0.hit + 8);
                    *(float *)((long)local_6f0.ray + 0x3c) = *(float *)(local_6f0.hit + 0xc);
                    *(float *)((long)local_6f0.ray + 0x40) = *(float *)(local_6f0.hit + 0x10);
                    *(float *)((long)local_6f0.ray + 0x44) = *(float *)(local_6f0.hit + 0x14);
                    *(float *)((long)local_6f0.ray + 0x48) = *(float *)(local_6f0.hit + 0x18);
                    *(float *)((long)local_6f0.ray + 0x4c) = *(float *)(local_6f0.hit + 0x1c);
                    *(float *)((long)local_6f0.ray + 0x50) = *(float *)(local_6f0.hit + 0x20);
                  }
                  else {
                    auVar200 = ZEXT1664(auVar200._0_16_);
                    (*pGVar121->intersectionFilterN)(&local_6f0);
                    auVar227 = ZEXT3264(_local_5e0);
                    auVar160 = ZEXT3264(local_640);
                    auVar236 = ZEXT3264(local_6c0);
                    auVar222 = ZEXT3264(local_6a0);
                    auVar212 = ZEXT3264(CONCAT428(fStack_5e4,
                                                  CONCAT424(fStack_5e8,
                                                            CONCAT420(fStack_5ec,
                                                                      CONCAT416(fStack_5f0,
                                                                                CONCAT412(fStack_5f4
                                                                                          ,CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
                    pre = local_6f8;
                    uVar119 = local_7a0._0_8_;
                    if (*local_6f0.valid != 0) goto LAB_01816b08;
LAB_01816bef:
                    (ray->super_RayK<1>).tfar = (float)local_7c0._0_4_;
                    pre = local_6f8;
                    uVar119 = local_7a0._0_8_;
                  }
                  auVar206 = auVar160._0_32_;
                  *(undefined4 *)(local_560[0] + uVar119 * 4) = 0;
                  auVar134 = local_560[0];
                  fVar162 = (ray->super_RayK<1>).tfar;
                  auVar139._4_4_ = fVar162;
                  auVar139._0_4_ = fVar162;
                  auVar139._8_4_ = fVar162;
                  auVar139._12_4_ = fVar162;
                  auVar139._16_4_ = fVar162;
                  auVar139._20_4_ = fVar162;
                  auVar139._24_4_ = fVar162;
                  auVar139._28_4_ = fVar162;
                  auVar198 = vcmpps_avx(local_3e0,auVar139,2);
                  auVar136 = vandps_avx(auVar198,local_560[0]);
                  local_560[0] = auVar136;
                  auVar134 = auVar134 & auVar198;
                  prim = local_700;
                  fVar162 = (float)local_780._0_4_;
                  if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar134 >> 0x7f,0) == '\0') &&
                        (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar134 >> 0xbf,0) == '\0') &&
                      (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar134[0x1f]) goto LAB_01815a8e;
                  auVar159._8_4_ = 0x7f800000;
                  auVar159._0_8_ = 0x7f8000007f800000;
                  auVar159._12_4_ = 0x7f800000;
                  auVar159._16_4_ = 0x7f800000;
                  auVar159._20_4_ = 0x7f800000;
                  auVar159._24_4_ = 0x7f800000;
                  auVar159._28_4_ = 0x7f800000;
                  auVar198 = vblendvps_avx(auVar159,local_3e0,auVar136);
                  auVar134 = vshufps_avx(auVar198,auVar198,0xb1);
                  auVar134 = vminps_avx(auVar198,auVar134);
                  auVar152 = vshufpd_avx(auVar134,auVar134,5);
                  auVar134 = vminps_avx(auVar134,auVar152);
                  auVar152 = vpermpd_avx2(auVar134,0x4e);
                  auVar134 = vminps_avx(auVar134,auVar152);
                  auVar198 = vcmpps_avx(auVar198,auVar134,0);
                  auVar134 = auVar136 & auVar198;
                  if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar134 >> 0x7f,0) != '\0') ||
                        (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar134 >> 0xbf,0) != '\0') ||
                      (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar134[0x1f] < '\0') {
                    auVar136 = vandps_avx(auVar198,auVar136);
                  }
                  local_7c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  uVar118 = vmovmskps_avx(auVar136);
                  uVar116 = 0;
                  for (; (uVar118 & 1) == 0; uVar118 = uVar118 >> 1 | 0x80000000) {
                    uVar116 = uVar116 + 1;
                  }
                  uVar119 = (ulong)uVar116;
                } while( true );
              }
              fVar161 = local_1e0[uVar119];
              fVar140 = *(float *)((long)&local_1c0 + uVar119 * 4);
              fVar142 = 1.0 - fVar161;
              fVar141 = fVar142 * fVar142 * -3.0;
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),
                                        ZEXT416((uint)(fVar161 * fVar142)),ZEXT416(0xc0000000));
              auVar10 = vfmsub132ss_fma(ZEXT416((uint)(fVar161 * fVar142)),
                                        ZEXT416((uint)(fVar161 * fVar161)),ZEXT416(0x40000000));
              auVar200 = ZEXT464(0x40400000);
              fVar142 = auVar20._0_4_ * 3.0;
              fVar143 = auVar10._0_4_ * 3.0;
              fVar144 = fVar161 * fVar161 * 3.0;
              auVar188._0_4_ = fVar144 * local_740;
              auVar188._4_4_ = fVar144 * fStack_73c;
              auVar188._8_4_ = fVar144 * fStack_738;
              auVar188._12_4_ = fVar144 * fStack_734;
              auVar163._4_4_ = fVar143;
              auVar163._0_4_ = fVar143;
              auVar163._8_4_ = fVar143;
              auVar163._12_4_ = fVar143;
              auVar20 = vfmadd132ps_fma(auVar163,auVar188,*pauVar3);
              auVar177._4_4_ = fVar142;
              auVar177._0_4_ = fVar142;
              auVar177._8_4_ = fVar142;
              auVar177._12_4_ = fVar142;
              auVar20 = vfmadd132ps_fma(auVar177,auVar20,*pauVar2);
              auVar164._4_4_ = fVar141;
              auVar164._0_4_ = fVar141;
              auVar164._8_4_ = fVar141;
              auVar164._12_4_ = fVar141;
              auVar20 = vfmadd132ps_fma(auVar164,auVar20,*pauVar1);
              (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar119 * 4);
              uVar125 = vmovlps_avx(auVar20);
              *(undefined8 *)&(ray->Ng).field_0 = uVar125;
              fVar141 = (float)vextractps_avx(auVar20,2);
              (ray->Ng).field_0.field_0.z = fVar141;
              ray->u = fVar161;
              ray->v = fVar140;
              ray->primID = uVar118;
              ray->geomID = uVar116;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              prim = local_700;
            }
LAB_01815a8e:
            local_780._0_4_ = fVar162;
            auVar160 = ZEXT3264(local_620);
            auVar183 = ZEXT3264(local_580);
            goto LAB_018157f5;
          }
        }
        auVar212 = ZEXT3264(auVar221);
        auVar183 = ZEXT3264(local_580);
        auVar160 = ZEXT3264(local_620);
        auVar222 = ZEXT3264(local_6a0);
      }
LAB_018157f5:
      if (8 < iVar18) {
        _local_5e0 = auVar227._0_32_;
        local_640 = auVar206;
        local_380._4_4_ = iVar18;
        local_380._0_4_ = iVar18;
        local_380._8_4_ = iVar18;
        local_380._12_4_ = iVar18;
        local_380._16_4_ = iVar18;
        local_380._20_4_ = iVar18;
        local_380._24_4_ = iVar18;
        local_380._28_4_ = iVar18;
        local_3a0._4_4_ = local_780._0_4_;
        local_3a0._0_4_ = local_780._0_4_;
        fStack_398 = (float)local_780._0_4_;
        fStack_394 = (float)local_780._0_4_;
        fStack_390 = (float)local_780._0_4_;
        fStack_38c = (float)local_780._0_4_;
        fStack_388 = (float)local_780._0_4_;
        fStack_384 = (float)local_780._0_4_;
        auVar20 = vpermilps_avx(local_5c0._0_16_,0xff);
        local_3c0._8_8_ = auVar20._0_8_;
        local_3c0._0_8_ = local_3c0._8_8_;
        local_3c0._16_8_ = local_3c0._8_8_;
        local_3c0._24_8_ = local_3c0._8_8_;
        local_140 = 1.0 / (float)local_4c0._0_4_;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        lVar123 = 8;
LAB_01815b2e:
        auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar123 * 4 + lVar25);
        auVar198 = *(undefined1 (*) [32])(lVar25 + 0x21aa768 + lVar123 * 4);
        auVar134 = *(undefined1 (*) [32])(lVar25 + 0x21aabec + lVar123 * 4);
        pauVar5 = (undefined1 (*) [32])(lVar25 + 0x21ab070 + lVar123 * 4);
        fVar145 = *(float *)*pauVar5;
        fVar207 = *(float *)(*pauVar5 + 4);
        fVar229 = *(float *)(*pauVar5 + 8);
        fVar90 = *(float *)(*pauVar5 + 0xc);
        fVar91 = *(float *)(*pauVar5 + 0x10);
        fVar92 = *(float *)(*pauVar5 + 0x14);
        fVar93 = *(float *)(*pauVar5 + 0x18);
        auVar115 = *(undefined1 (*) [28])*pauVar5;
        auVar228._0_4_ = local_460 * fVar145;
        auVar228._4_4_ = fStack_45c * fVar207;
        auVar228._8_4_ = fStack_458 * fVar229;
        auVar228._12_4_ = fStack_454 * fVar90;
        auVar228._16_4_ = fStack_450 * fVar91;
        auVar228._20_4_ = fStack_44c * fVar92;
        auVar228._28_36_ = auVar227._28_36_;
        auVar228._24_4_ = fStack_448 * fVar93;
        auVar201._0_4_ = auVar212._0_4_ * fVar145;
        auVar201._4_4_ = auVar212._4_4_ * fVar207;
        auVar201._8_4_ = auVar212._8_4_ * fVar229;
        auVar201._12_4_ = auVar212._12_4_ * fVar90;
        auVar201._16_4_ = auVar212._16_4_ * fVar91;
        auVar201._20_4_ = auVar212._20_4_ * fVar92;
        auVar201._28_36_ = auVar200._28_36_;
        auVar201._24_4_ = auVar212._24_4_ * fVar93;
        auVar155 = auVar160._0_32_;
        auVar20 = vfmadd231ps_fma(auVar228._0_32_,auVar134,auVar155);
        auVar10 = vfmadd231ps_fma(auVar201._0_32_,auVar134,auVar183._0_32_);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar198,auVar222._0_32_);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar198,local_4a0);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar136,auVar236._0_32_);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar136,local_480);
        auVar152 = *(undefined1 (*) [32])(bezier_basis1 + lVar123 * 4 + lVar25);
        auVar174 = *(undefined1 (*) [32])(lVar25 + 0x21acb88 + lVar123 * 4);
        auVar209 = *(undefined1 (*) [32])(lVar25 + 0x21ad00c + lVar123 * 4);
        pfVar6 = (float *)(lVar25 + 0x21ad490 + lVar123 * 4);
        fVar94 = *pfVar6;
        fVar95 = pfVar6[1];
        fVar96 = pfVar6[2];
        fVar97 = pfVar6[3];
        fVar98 = pfVar6[4];
        fVar99 = pfVar6[5];
        fVar100 = pfVar6[6];
        auVar213._0_4_ = fVar94 * local_460;
        auVar213._4_4_ = fVar95 * fStack_45c;
        auVar213._8_4_ = fVar96 * fStack_458;
        auVar213._12_4_ = fVar97 * fStack_454;
        auVar213._16_4_ = fVar98 * fStack_450;
        auVar213._20_4_ = fVar99 * fStack_44c;
        auVar213._28_36_ = auVar212._28_36_;
        auVar213._24_4_ = fVar100 * fStack_448;
        auVar59._4_4_ = auVar212._4_4_ * fVar95;
        auVar59._0_4_ = auVar212._0_4_ * fVar94;
        auVar59._8_4_ = auVar212._8_4_ * fVar96;
        auVar59._12_4_ = auVar212._12_4_ * fVar97;
        auVar59._16_4_ = auVar212._16_4_ * fVar98;
        auVar59._20_4_ = auVar212._20_4_ * fVar99;
        auVar59._24_4_ = auVar212._24_4_ * fVar100;
        auVar59._28_4_ = fStack_444;
        auVar11 = vfmadd231ps_fma(auVar213._0_32_,auVar209,auVar155);
        auVar12 = vfmadd231ps_fma(auVar59,auVar209,auVar183._0_32_);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar174,auVar222._0_32_);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar174,local_4a0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar152,auVar236._0_32_);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar152,local_480);
        local_500 = ZEXT1632(auVar11);
        local_300 = ZEXT1632(auVar20);
        auVar22 = vsubps_avx(local_500,local_300);
        auVar173 = ZEXT1632(auVar12);
        local_320 = ZEXT1632(auVar10);
        local_340 = vsubps_avx(auVar173,local_320);
        auVar87._4_4_ = auVar22._4_4_ * auVar10._4_4_;
        auVar87._0_4_ = auVar22._0_4_ * auVar10._0_4_;
        auVar87._8_4_ = auVar22._8_4_ * auVar10._8_4_;
        auVar87._12_4_ = auVar22._12_4_ * auVar10._12_4_;
        auVar87._16_4_ = auVar22._16_4_ * 0.0;
        auVar87._20_4_ = auVar22._20_4_ * 0.0;
        auVar87._24_4_ = auVar22._24_4_ * 0.0;
        auVar87._28_4_ = local_4a0._28_4_;
        auVar200 = ZEXT3264(auVar155);
        fVar162 = local_340._0_4_;
        auVar236._0_4_ = auVar20._0_4_ * fVar162;
        fVar161 = local_340._4_4_;
        auVar236._4_4_ = auVar20._4_4_ * fVar161;
        fVar140 = local_340._8_4_;
        auVar236._8_4_ = auVar20._8_4_ * fVar140;
        fVar141 = local_340._12_4_;
        auVar236._12_4_ = auVar20._12_4_ * fVar141;
        fVar142 = local_340._16_4_;
        auVar236._16_4_ = fVar142 * 0.0;
        fVar143 = local_340._20_4_;
        auVar236._20_4_ = fVar143 * 0.0;
        fVar144 = local_340._24_4_;
        auVar236._28_36_ = auVar160._28_36_;
        auVar236._24_4_ = fVar144 * 0.0;
        auVar227 = ZEXT3264(auVar134);
        auVar23 = vsubps_avx(auVar87,auVar236._0_32_);
        _local_360 = *pauVar5;
        auVar147 = _local_360;
        auVar60._4_4_ = local_100._4_4_ * fVar207;
        auVar60._0_4_ = (float)local_100 * fVar145;
        auVar60._8_4_ = (float)uStack_f8 * fVar229;
        auVar60._12_4_ = uStack_f8._4_4_ * fVar90;
        auVar60._16_4_ = (float)uStack_f0 * fVar91;
        auVar60._20_4_ = uStack_f0._4_4_ * fVar92;
        auVar60._24_4_ = (float)uStack_e8 * fVar93;
        auVar60._28_4_ = local_4a0._28_4_;
        auVar20 = vfmadd231ps_fma(auVar60,auVar134,local_e0);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_c0,auVar198);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,auVar136);
        auVar61._4_4_ = fVar95 * local_100._4_4_;
        auVar61._0_4_ = fVar94 * (float)local_100;
        auVar61._8_4_ = fVar96 * (float)uStack_f8;
        auVar61._12_4_ = fVar97 * uStack_f8._4_4_;
        auVar61._16_4_ = fVar98 * (float)uStack_f0;
        auVar61._20_4_ = fVar99 * uStack_f0._4_4_;
        auVar61._24_4_ = fVar100 * (float)uStack_e8;
        auVar61._28_4_ = uStack_e8._4_4_;
        auVar10 = vfmadd231ps_fma(auVar61,auVar209,local_e0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar174,local_c0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar152,local_a0);
        auVar88._4_4_ = fVar161 * fVar161;
        auVar88._0_4_ = fVar162 * fVar162;
        auVar88._8_4_ = fVar140 * fVar140;
        auVar88._12_4_ = fVar141 * fVar141;
        auVar88._16_4_ = fVar142 * fVar142;
        auVar88._20_4_ = fVar143 * fVar143;
        auVar88._24_4_ = fVar144 * fVar144;
        auVar88._28_4_ = local_480._28_4_;
        auVar11 = vfmadd231ps_fma(auVar88,auVar22,auVar22);
        auVar21 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar10));
        auVar215._0_4_ = auVar21._0_4_ * auVar21._0_4_ * auVar11._0_4_;
        auVar215._4_4_ = auVar21._4_4_ * auVar21._4_4_ * auVar11._4_4_;
        auVar215._8_4_ = auVar21._8_4_ * auVar21._8_4_ * auVar11._8_4_;
        auVar215._12_4_ = auVar21._12_4_ * auVar21._12_4_ * auVar11._12_4_;
        auVar215._16_4_ = auVar21._16_4_ * auVar21._16_4_ * 0.0;
        auVar215._20_4_ = auVar21._20_4_ * auVar21._20_4_ * 0.0;
        auVar215._24_4_ = auVar21._24_4_ * auVar21._24_4_ * 0.0;
        auVar215._28_4_ = 0;
        auVar62._4_4_ = auVar23._4_4_ * auVar23._4_4_;
        auVar62._0_4_ = auVar23._0_4_ * auVar23._0_4_;
        auVar62._8_4_ = auVar23._8_4_ * auVar23._8_4_;
        auVar62._12_4_ = auVar23._12_4_ * auVar23._12_4_;
        auVar62._16_4_ = auVar23._16_4_ * auVar23._16_4_;
        auVar62._20_4_ = auVar23._20_4_ * auVar23._20_4_;
        auVar62._24_4_ = auVar23._24_4_ * auVar23._24_4_;
        auVar62._28_4_ = auVar23._28_4_;
        auVar21 = vcmpps_avx(auVar62,auVar215,2);
        local_260 = (int)lVar123;
        auVar216._4_4_ = local_260;
        auVar216._0_4_ = local_260;
        auVar216._8_4_ = local_260;
        auVar216._12_4_ = local_260;
        auVar216._16_4_ = local_260;
        auVar216._20_4_ = local_260;
        auVar216._24_4_ = local_260;
        auVar216._28_4_ = local_260;
        auVar23 = vpor_avx2(auVar216,_DAT_01fe9900);
        auVar128 = vpcmpgtd_avx2(local_380,auVar23);
        auVar23 = auVar128 & auVar21;
        if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0x7f,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0xbf,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar23[0x1f]) {
          auVar212 = ZEXT3264(CONCAT428(fStack_5e4,
                                        CONCAT424(fStack_5e8,
                                                  CONCAT420(fStack_5ec,
                                                            CONCAT416(fStack_5f0,
                                                                      CONCAT412(fStack_5f4,
                                                                                CONCAT48(fStack_5f8,
                                                                                         CONCAT44(
                                                  fStack_5fc,local_600))))))));
          auVar222 = ZEXT3264(local_6a0);
          auVar236 = ZEXT3264(local_6c0);
        }
        else {
          local_4c0 = vandps_avx(auVar128,auVar21);
          auVar63._4_4_ = fVar95 * (float)local_5e0._4_4_;
          auVar63._0_4_ = fVar94 * (float)local_5e0._0_4_;
          auVar63._8_4_ = fVar96 * fStack_5d8;
          auVar63._12_4_ = fVar97 * fStack_5d4;
          auVar63._16_4_ = fVar98 * fStack_5d0;
          auVar63._20_4_ = fVar99 * fStack_5cc;
          auVar63._24_4_ = fVar100 * fStack_5c8;
          auVar63._28_4_ = auVar21._28_4_;
          auVar11 = vfmadd213ps_fma(auVar209,local_640,auVar63);
          auVar113._8_8_ = uStack_4d8;
          auVar113._0_8_ = local_4e0;
          auVar113._16_8_ = uStack_4d0;
          auVar113._24_8_ = uStack_4c8;
          auVar11 = vfmadd213ps_fma(auVar174,auVar113,ZEXT1632(auVar11));
          auVar11 = vfmadd213ps_fma(auVar152,local_520,ZEXT1632(auVar11));
          local_360._0_4_ = auVar115._0_4_;
          local_360._4_4_ = auVar115._4_4_;
          fStack_358 = auVar115._8_4_;
          fStack_354 = auVar115._12_4_;
          fStack_350 = auVar115._16_4_;
          fStack_34c = auVar115._20_4_;
          fStack_348 = auVar115._24_4_;
          auVar64._4_4_ = (float)local_5e0._4_4_ * (float)local_360._4_4_;
          auVar64._0_4_ = (float)local_5e0._0_4_ * (float)local_360._0_4_;
          auVar64._8_4_ = fStack_5d8 * fStack_358;
          auVar64._12_4_ = fStack_5d4 * fStack_354;
          auVar64._16_4_ = fStack_5d0 * fStack_350;
          auVar64._20_4_ = fStack_5cc * fStack_34c;
          auVar64._24_4_ = fStack_5c8 * fStack_348;
          auVar64._28_4_ = auVar21._28_4_;
          auVar12 = vfmadd213ps_fma(auVar134,local_640,auVar64);
          auVar12 = vfmadd213ps_fma(auVar198,auVar113,ZEXT1632(auVar12));
          auVar198 = *(undefined1 (*) [32])(lVar25 + 0x21ab4f4 + lVar123 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar25 + 0x21ab978 + lVar123 * 4);
          auVar152 = *(undefined1 (*) [32])(lVar25 + 0x21abdfc + lVar123 * 4);
          pfVar6 = (float *)(lVar25 + 0x21ac280 + lVar123 * 4);
          fVar162 = *pfVar6;
          fVar161 = pfVar6[1];
          fVar140 = pfVar6[2];
          fVar141 = pfVar6[3];
          fVar142 = pfVar6[4];
          fVar143 = pfVar6[5];
          fVar144 = pfVar6[6];
          auVar210._0_4_ = local_460 * fVar162;
          auVar210._4_4_ = fStack_45c * fVar161;
          auVar210._8_4_ = fStack_458 * fVar140;
          auVar210._12_4_ = fStack_454 * fVar141;
          auVar210._16_4_ = fStack_450 * fVar142;
          auVar210._20_4_ = fStack_44c * fVar143;
          auVar210._24_4_ = fStack_448 * fVar144;
          auVar210._28_4_ = 0;
          auVar225._0_4_ = local_600 * fVar162;
          auVar225._4_4_ = fStack_5fc * fVar161;
          auVar225._8_4_ = fStack_5f8 * fVar140;
          auVar225._12_4_ = fStack_5f4 * fVar141;
          auVar225._16_4_ = fStack_5f0 * fVar142;
          auVar225._20_4_ = fStack_5ec * fVar143;
          auVar225._24_4_ = fStack_5e8 * fVar144;
          auVar225._28_4_ = 0;
          auVar65._4_4_ = fVar161 * (float)local_5e0._4_4_;
          auVar65._0_4_ = fVar162 * (float)local_5e0._0_4_;
          auVar65._8_4_ = fVar140 * fStack_5d8;
          auVar65._12_4_ = fVar141 * fStack_5d4;
          auVar65._16_4_ = fVar142 * fStack_5d0;
          auVar65._20_4_ = fVar143 * fStack_5cc;
          auVar65._24_4_ = fVar144 * fStack_5c8;
          auVar65._28_4_ = pfVar6[7];
          auVar13 = vfmadd231ps_fma(auVar210,auVar152,local_620);
          auVar196 = vfmadd231ps_fma(auVar225,auVar152,local_580);
          auVar14 = vfmadd231ps_fma(auVar65,local_640,auVar152);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar134,local_6a0);
          auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar134,local_4a0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar113,auVar134);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar198,local_6c0);
          auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar198,local_480);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_520,auVar198);
          pfVar6 = (float *)(lVar25 + 0x21ae6a0 + lVar123 * 4);
          fVar162 = *pfVar6;
          fVar161 = pfVar6[1];
          fVar140 = pfVar6[2];
          fVar141 = pfVar6[3];
          fVar142 = pfVar6[4];
          fVar143 = pfVar6[5];
          fVar144 = pfVar6[6];
          auVar66._4_4_ = fStack_45c * fVar161;
          auVar66._0_4_ = local_460 * fVar162;
          auVar66._8_4_ = fStack_458 * fVar140;
          auVar66._12_4_ = fStack_454 * fVar141;
          auVar66._16_4_ = fStack_450 * fVar142;
          auVar66._20_4_ = fStack_44c * fVar143;
          auVar66._24_4_ = fStack_448 * fVar144;
          auVar66._28_4_ = fStack_444;
          auVar67._4_4_ = fStack_5fc * fVar161;
          auVar67._0_4_ = local_600 * fVar162;
          auVar67._8_4_ = fStack_5f8 * fVar140;
          auVar67._12_4_ = fStack_5f4 * fVar141;
          auVar67._16_4_ = fStack_5f0 * fVar142;
          auVar67._20_4_ = fStack_5ec * fVar143;
          auVar67._24_4_ = fStack_5e8 * fVar144;
          auVar67._28_4_ = local_520._28_4_;
          auVar68._4_4_ = (float)local_5e0._4_4_ * fVar161;
          auVar68._0_4_ = (float)local_5e0._0_4_ * fVar162;
          auVar68._8_4_ = fStack_5d8 * fVar140;
          auVar68._12_4_ = fStack_5d4 * fVar141;
          auVar68._16_4_ = fStack_5d0 * fVar142;
          auVar68._20_4_ = fStack_5cc * fVar143;
          auVar68._24_4_ = fStack_5c8 * fVar144;
          auVar68._28_4_ = pfVar6[7];
          auVar198 = *(undefined1 (*) [32])(lVar25 + 0x21ae21c + lVar123 * 4);
          auVar15 = vfmadd231ps_fma(auVar66,auVar198,local_620);
          auVar16 = vfmadd231ps_fma(auVar67,auVar198,local_580);
          auVar126 = vfmadd231ps_fma(auVar68,auVar198,local_640);
          auVar198 = *(undefined1 (*) [32])(lVar25 + 0x21add98 + lVar123 * 4);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar198,local_6a0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar198,local_4a0);
          auVar114._8_8_ = uStack_4d8;
          auVar114._0_8_ = local_4e0;
          auVar114._16_8_ = uStack_4d0;
          auVar114._24_8_ = uStack_4c8;
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar198,auVar114);
          auVar198 = *(undefined1 (*) [32])(lVar25 + 0x21ad914 + lVar123 * 4);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar198,local_6c0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar198,local_480);
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_520,auVar198);
          auVar198 = vandps_avx(ZEXT1632(auVar13),local_180);
          auVar134 = vandps_avx(ZEXT1632(auVar196),local_180);
          auVar134 = vmaxps_avx(auVar198,auVar134);
          auVar198 = vandps_avx(ZEXT1632(auVar14),local_180);
          auVar198 = vmaxps_avx(auVar134,auVar198);
          auVar198 = vcmpps_avx(auVar198,_local_3a0,1);
          auVar152 = vblendvps_avx(ZEXT1632(auVar13),auVar22,auVar198);
          auVar174 = vblendvps_avx(ZEXT1632(auVar196),local_340,auVar198);
          auVar198 = vandps_avx(ZEXT1632(auVar15),local_180);
          auVar134 = vandps_avx(ZEXT1632(auVar16),local_180);
          auVar134 = vmaxps_avx(auVar198,auVar134);
          auVar198 = vandps_avx(local_180,ZEXT1632(auVar126));
          auVar198 = vmaxps_avx(auVar134,auVar198);
          auVar134 = vcmpps_avx(auVar198,_local_3a0,1);
          auVar198 = vblendvps_avx(ZEXT1632(auVar15),auVar22,auVar134);
          auVar134 = vblendvps_avx(ZEXT1632(auVar16),local_340,auVar134);
          auVar12 = vfmadd213ps_fma(auVar136,local_520,ZEXT1632(auVar12));
          auVar13 = vfmadd213ps_fma(auVar152,auVar152,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar174,auVar174);
          auVar136 = vrsqrtps_avx(ZEXT1632(auVar13));
          fVar162 = auVar136._0_4_;
          fVar161 = auVar136._4_4_;
          fVar140 = auVar136._8_4_;
          fVar141 = auVar136._12_4_;
          fVar142 = auVar136._16_4_;
          fVar143 = auVar136._20_4_;
          fVar144 = auVar136._24_4_;
          auVar69._4_4_ = fVar161 * fVar161 * fVar161 * auVar13._4_4_ * -0.5;
          auVar69._0_4_ = fVar162 * fVar162 * fVar162 * auVar13._0_4_ * -0.5;
          auVar69._8_4_ = fVar140 * fVar140 * fVar140 * auVar13._8_4_ * -0.5;
          auVar69._12_4_ = fVar141 * fVar141 * fVar141 * auVar13._12_4_ * -0.5;
          auVar69._16_4_ = fVar142 * fVar142 * fVar142 * -0.0;
          auVar69._20_4_ = fVar143 * fVar143 * fVar143 * -0.0;
          auVar69._24_4_ = fVar144 * fVar144 * fVar144 * -0.0;
          auVar69._28_4_ = 0;
          auVar235._8_4_ = 0x3fc00000;
          auVar235._0_8_ = 0x3fc000003fc00000;
          auVar235._12_4_ = 0x3fc00000;
          auVar235._16_4_ = 0x3fc00000;
          auVar235._20_4_ = 0x3fc00000;
          auVar235._24_4_ = 0x3fc00000;
          auVar235._28_4_ = 0x3fc00000;
          auVar13 = vfmadd231ps_fma(auVar69,auVar235,auVar136);
          fVar162 = auVar13._0_4_;
          fVar161 = auVar13._4_4_;
          auVar70._4_4_ = auVar174._4_4_ * fVar161;
          auVar70._0_4_ = auVar174._0_4_ * fVar162;
          fVar140 = auVar13._8_4_;
          auVar70._8_4_ = auVar174._8_4_ * fVar140;
          fVar141 = auVar13._12_4_;
          auVar70._12_4_ = auVar174._12_4_ * fVar141;
          auVar70._16_4_ = auVar174._16_4_ * 0.0;
          auVar70._20_4_ = auVar174._20_4_ * 0.0;
          auVar70._24_4_ = auVar174._24_4_ * 0.0;
          auVar70._28_4_ = auVar174._28_4_;
          auVar71._4_4_ = fVar161 * -auVar152._4_4_;
          auVar71._0_4_ = fVar162 * -auVar152._0_4_;
          auVar71._8_4_ = fVar140 * -auVar152._8_4_;
          auVar71._12_4_ = fVar141 * -auVar152._12_4_;
          auVar71._16_4_ = -auVar152._16_4_ * 0.0;
          auVar71._20_4_ = -auVar152._20_4_ * 0.0;
          auVar71._24_4_ = -auVar152._24_4_ * 0.0;
          auVar71._28_4_ = auVar136._28_4_;
          auVar13 = vfmadd213ps_fma(auVar198,auVar198,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar134,auVar134);
          auVar136 = vrsqrtps_avx(ZEXT1632(auVar13));
          auVar72._28_4_ = uStack_5c4;
          auVar72._0_28_ =
               ZEXT1628(CONCAT412(fVar141 * 0.0,
                                  CONCAT48(fVar140 * 0.0,CONCAT44(fVar161 * 0.0,fVar162 * 0.0))));
          fVar162 = auVar136._0_4_;
          fVar161 = auVar136._4_4_;
          fVar140 = auVar136._8_4_;
          fVar141 = auVar136._12_4_;
          fVar142 = auVar136._16_4_;
          fVar143 = auVar136._20_4_;
          fVar144 = auVar136._24_4_;
          auVar73._4_4_ = fVar161 * fVar161 * fVar161 * auVar13._4_4_ * -0.5;
          auVar73._0_4_ = fVar162 * fVar162 * fVar162 * auVar13._0_4_ * -0.5;
          auVar73._8_4_ = fVar140 * fVar140 * fVar140 * auVar13._8_4_ * -0.5;
          auVar73._12_4_ = fVar141 * fVar141 * fVar141 * auVar13._12_4_ * -0.5;
          auVar73._16_4_ = fVar142 * fVar142 * fVar142 * -0.0;
          auVar73._20_4_ = fVar143 * fVar143 * fVar143 * -0.0;
          auVar73._24_4_ = fVar144 * fVar144 * fVar144 * -0.0;
          auVar73._28_4_ = 0;
          auVar13 = vfmadd231ps_fma(auVar73,auVar235,auVar136);
          fVar162 = auVar13._0_4_;
          auVar232._0_4_ = auVar134._0_4_ * fVar162;
          fVar161 = auVar13._4_4_;
          auVar232._4_4_ = auVar134._4_4_ * fVar161;
          fVar140 = auVar13._8_4_;
          auVar232._8_4_ = auVar134._8_4_ * fVar140;
          fVar141 = auVar13._12_4_;
          auVar232._12_4_ = auVar134._12_4_ * fVar141;
          auVar232._16_4_ = auVar134._16_4_ * 0.0;
          auVar232._20_4_ = auVar134._20_4_ * 0.0;
          auVar232._24_4_ = auVar134._24_4_ * 0.0;
          auVar232._28_4_ = 0;
          auVar74._4_4_ = fVar161 * -auVar198._4_4_;
          auVar74._0_4_ = fVar162 * -auVar198._0_4_;
          auVar74._8_4_ = fVar140 * -auVar198._8_4_;
          auVar74._12_4_ = fVar141 * -auVar198._12_4_;
          auVar74._16_4_ = -auVar198._16_4_ * 0.0;
          auVar74._20_4_ = -auVar198._20_4_ * 0.0;
          auVar74._24_4_ = -auVar198._24_4_ * 0.0;
          auVar74._28_4_ = auVar136._28_4_;
          auVar75._28_4_ = 0xbf000000;
          auVar75._0_28_ =
               ZEXT1628(CONCAT412(fVar141 * 0.0,
                                  CONCAT48(fVar140 * 0.0,CONCAT44(fVar161 * 0.0,fVar162 * 0.0))));
          auVar13 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar20),local_300);
          auVar136 = ZEXT1632(auVar20);
          auVar196 = vfmadd213ps_fma(auVar71,auVar136,local_320);
          auVar14 = vfmadd213ps_fma(auVar72,auVar136,ZEXT1632(auVar12));
          auVar126 = vfnmadd213ps_fma(auVar70,auVar136,local_300);
          auVar15 = vfmadd213ps_fma(auVar232,ZEXT1632(auVar10),local_500);
          auVar202 = vfnmadd213ps_fma(auVar71,auVar136,local_320);
          auVar136 = ZEXT1632(auVar10);
          auVar16 = vfmadd213ps_fma(auVar74,auVar136,auVar173);
          auVar137 = ZEXT1632(auVar20);
          auVar20 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar137,auVar72);
          auVar12 = vfmadd213ps_fma(auVar75,auVar136,ZEXT1632(auVar11));
          auVar26 = vfnmadd213ps_fma(auVar232,auVar136,local_500);
          auVar27 = vfnmadd213ps_fma(auVar74,auVar136,auVar173);
          auVar28 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar10),auVar75);
          auVar136 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar202));
          auVar198 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar20));
          auVar76._4_4_ = auVar136._4_4_ * auVar20._4_4_;
          auVar76._0_4_ = auVar136._0_4_ * auVar20._0_4_;
          auVar76._8_4_ = auVar136._8_4_ * auVar20._8_4_;
          auVar76._12_4_ = auVar136._12_4_ * auVar20._12_4_;
          auVar76._16_4_ = auVar136._16_4_ * 0.0;
          auVar76._20_4_ = auVar136._20_4_ * 0.0;
          auVar76._24_4_ = auVar136._24_4_ * 0.0;
          auVar76._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar76,ZEXT1632(auVar202),auVar198);
          auVar77._4_4_ = auVar126._4_4_ * auVar198._4_4_;
          auVar77._0_4_ = auVar126._0_4_ * auVar198._0_4_;
          auVar77._8_4_ = auVar126._8_4_ * auVar198._8_4_;
          auVar77._12_4_ = auVar126._12_4_ * auVar198._12_4_;
          auVar77._16_4_ = auVar198._16_4_ * 0.0;
          auVar77._20_4_ = auVar198._20_4_ * 0.0;
          auVar77._24_4_ = auVar198._24_4_ * 0.0;
          auVar77._28_4_ = auVar198._28_4_;
          auVar134 = ZEXT1632(auVar126);
          auVar198 = vsubps_avx(ZEXT1632(auVar15),auVar134);
          auVar174 = ZEXT1632(auVar20);
          auVar20 = vfmsub231ps_fma(auVar77,auVar174,auVar198);
          auVar78._4_4_ = auVar202._4_4_ * auVar198._4_4_;
          auVar78._0_4_ = auVar202._0_4_ * auVar198._0_4_;
          auVar78._8_4_ = auVar202._8_4_ * auVar198._8_4_;
          auVar78._12_4_ = auVar202._12_4_ * auVar198._12_4_;
          auVar78._16_4_ = auVar198._16_4_ * 0.0;
          auVar78._20_4_ = auVar198._20_4_ * 0.0;
          auVar78._24_4_ = auVar198._24_4_ * 0.0;
          auVar78._28_4_ = auVar198._28_4_;
          auVar126 = vfmsub231ps_fma(auVar78,auVar134,auVar136);
          auVar136 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar136,ZEXT1632(auVar20));
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar136,ZEXT1632(auVar11));
          auVar209 = vcmpps_avx(ZEXT1632(auVar20),ZEXT1232(ZEXT412(0)) << 0x20,2);
          local_7c0 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar13),auVar209);
          local_5c0 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar196),auVar209);
          local_5a0 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar14),auVar209);
          local_7a0 = vblendvps_avx(auVar134,ZEXT1632(auVar15),auVar209);
          auVar136 = vblendvps_avx(ZEXT1632(auVar202),ZEXT1632(auVar16),auVar209);
          auVar198 = vblendvps_avx(auVar174,ZEXT1632(auVar12),auVar209);
          auVar134 = vblendvps_avx(ZEXT1632(auVar15),auVar134,auVar209);
          auVar152 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar202),auVar209);
          auVar20 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
          local_780._0_32_ = ZEXT1632(auVar20);
          auVar174 = vblendvps_avx(ZEXT1632(auVar12),auVar174,auVar209);
          auVar134 = vsubps_avx(auVar134,local_7c0);
          auVar152 = vsubps_avx(auVar152,local_5c0);
          auVar21 = vsubps_avx(auVar174,local_5a0);
          auVar22 = vsubps_avx(local_7c0,local_7a0);
          auVar23 = vsubps_avx(local_5c0,auVar136);
          auVar128 = vsubps_avx(local_5a0,auVar198);
          auVar193._0_4_ = local_7c0._0_4_ * auVar21._0_4_;
          auVar193._4_4_ = local_7c0._4_4_ * auVar21._4_4_;
          auVar193._8_4_ = local_7c0._8_4_ * auVar21._8_4_;
          auVar193._12_4_ = local_7c0._12_4_ * auVar21._12_4_;
          auVar193._16_4_ = local_7c0._16_4_ * auVar21._16_4_;
          auVar193._20_4_ = local_7c0._20_4_ * auVar21._20_4_;
          auVar193._24_4_ = local_7c0._24_4_ * auVar21._24_4_;
          auVar193._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar193,local_5a0,auVar134);
          auVar79._4_4_ = auVar134._4_4_ * local_5c0._4_4_;
          auVar79._0_4_ = auVar134._0_4_ * local_5c0._0_4_;
          auVar79._8_4_ = auVar134._8_4_ * local_5c0._8_4_;
          auVar79._12_4_ = auVar134._12_4_ * local_5c0._12_4_;
          auVar79._16_4_ = auVar134._16_4_ * local_5c0._16_4_;
          auVar79._20_4_ = auVar134._20_4_ * local_5c0._20_4_;
          auVar79._24_4_ = auVar134._24_4_ * local_5c0._24_4_;
          auVar79._28_4_ = auVar174._28_4_;
          auVar12 = vfmsub231ps_fma(auVar79,local_7c0,auVar152);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar194._0_4_ = auVar152._0_4_ * local_5a0._0_4_;
          auVar194._4_4_ = auVar152._4_4_ * local_5a0._4_4_;
          auVar194._8_4_ = auVar152._8_4_ * local_5a0._8_4_;
          auVar194._12_4_ = auVar152._12_4_ * local_5a0._12_4_;
          auVar194._16_4_ = auVar152._16_4_ * local_5a0._16_4_;
          auVar194._20_4_ = auVar152._20_4_ * local_5a0._20_4_;
          auVar194._24_4_ = auVar152._24_4_ * local_5a0._24_4_;
          auVar194._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar194,local_5c0,auVar21);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
          auVar227 = ZEXT3264(local_7a0);
          auVar195._0_4_ = auVar128._0_4_ * local_7a0._0_4_;
          auVar195._4_4_ = auVar128._4_4_ * local_7a0._4_4_;
          auVar195._8_4_ = auVar128._8_4_ * local_7a0._8_4_;
          auVar195._12_4_ = auVar128._12_4_ * local_7a0._12_4_;
          auVar195._16_4_ = auVar128._16_4_ * local_7a0._16_4_;
          auVar195._20_4_ = auVar128._20_4_ * local_7a0._20_4_;
          auVar195._24_4_ = auVar128._24_4_ * local_7a0._24_4_;
          auVar195._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar195,auVar22,auVar198);
          auVar80._4_4_ = auVar23._4_4_ * auVar198._4_4_;
          auVar80._0_4_ = auVar23._0_4_ * auVar198._0_4_;
          auVar80._8_4_ = auVar23._8_4_ * auVar198._8_4_;
          auVar80._12_4_ = auVar23._12_4_ * auVar198._12_4_;
          auVar80._16_4_ = auVar23._16_4_ * auVar198._16_4_;
          auVar80._20_4_ = auVar23._20_4_ * auVar198._20_4_;
          auVar80._24_4_ = auVar23._24_4_ * auVar198._24_4_;
          auVar80._28_4_ = auVar198._28_4_;
          auVar13 = vfmsub231ps_fma(auVar80,auVar136,auVar128);
          auVar81._4_4_ = auVar22._4_4_ * auVar136._4_4_;
          auVar81._0_4_ = auVar22._0_4_ * auVar136._0_4_;
          auVar81._8_4_ = auVar22._8_4_ * auVar136._8_4_;
          auVar81._12_4_ = auVar22._12_4_ * auVar136._12_4_;
          auVar81._16_4_ = auVar22._16_4_ * auVar136._16_4_;
          auVar81._20_4_ = auVar22._20_4_ * auVar136._20_4_;
          auVar81._24_4_ = auVar22._24_4_ * auVar136._24_4_;
          auVar81._28_4_ = auVar136._28_4_;
          auVar196 = vfmsub231ps_fma(auVar81,auVar23,local_7a0);
          auVar198 = ZEXT832(0) << 0x20;
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar198,ZEXT1632(auVar11));
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar198,ZEXT1632(auVar13));
          auVar136 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
          auVar136 = vcmpps_avx(auVar136,ZEXT832(0) << 0x20,2);
          auVar196 = auVar136._16_16_;
          auVar11 = vpackssdw_avx(auVar136._0_16_,auVar196);
          auVar20 = vpand_avx(auVar11,auVar20);
          auVar136 = vpmovsxwd_avx2(auVar20);
          if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar136 >> 0x7f,0) == '\0') &&
                (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar136 >> 0xbf,0) == '\0') &&
              (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar136[0x1f]) {
LAB_018165b0:
            auVar200 = ZEXT1664(auVar196);
            auVar182._8_8_ = local_560[1]._8_8_;
            auVar182._0_8_ = local_560[1]._0_8_;
            auVar182._16_8_ = local_560[1]._16_8_;
            auVar182._24_8_ = local_560[1]._24_8_;
          }
          else {
            auVar82._4_4_ = auVar152._4_4_ * auVar128._4_4_;
            auVar82._0_4_ = auVar152._0_4_ * auVar128._0_4_;
            auVar82._8_4_ = auVar152._8_4_ * auVar128._8_4_;
            auVar82._12_4_ = auVar152._12_4_ * auVar128._12_4_;
            auVar82._16_4_ = auVar152._16_4_ * auVar128._16_4_;
            auVar82._20_4_ = auVar152._20_4_ * auVar128._20_4_;
            auVar82._24_4_ = auVar152._24_4_ * auVar128._24_4_;
            auVar82._28_4_ = auVar136._28_4_;
            auVar15 = vfmsub231ps_fma(auVar82,auVar23,auVar21);
            auVar199._0_4_ = auVar22._0_4_ * auVar21._0_4_;
            auVar199._4_4_ = auVar22._4_4_ * auVar21._4_4_;
            auVar199._8_4_ = auVar22._8_4_ * auVar21._8_4_;
            auVar199._12_4_ = auVar22._12_4_ * auVar21._12_4_;
            auVar199._16_4_ = auVar22._16_4_ * auVar21._16_4_;
            auVar199._20_4_ = auVar22._20_4_ * auVar21._20_4_;
            auVar199._24_4_ = auVar22._24_4_ * auVar21._24_4_;
            auVar199._28_4_ = 0;
            auVar196 = vfmsub231ps_fma(auVar199,auVar134,auVar128);
            auVar83._4_4_ = auVar134._4_4_ * auVar23._4_4_;
            auVar83._0_4_ = auVar134._0_4_ * auVar23._0_4_;
            auVar83._8_4_ = auVar134._8_4_ * auVar23._8_4_;
            auVar83._12_4_ = auVar134._12_4_ * auVar23._12_4_;
            auVar83._16_4_ = auVar134._16_4_ * auVar23._16_4_;
            auVar83._20_4_ = auVar134._20_4_ * auVar23._20_4_;
            auVar83._24_4_ = auVar134._24_4_ * auVar23._24_4_;
            auVar83._28_4_ = auVar23._28_4_;
            auVar16 = vfmsub231ps_fma(auVar83,auVar22,auVar152);
            auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar196),ZEXT1632(auVar16));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar15),auVar198);
            auVar136 = vrcpps_avx(ZEXT1632(auVar14));
            auVar226._8_4_ = 0x3f800000;
            auVar226._0_8_ = 0x3f8000003f800000;
            auVar226._12_4_ = 0x3f800000;
            auVar226._16_4_ = 0x3f800000;
            auVar226._20_4_ = 0x3f800000;
            auVar226._24_4_ = 0x3f800000;
            auVar226._28_4_ = 0x3f800000;
            auVar227 = ZEXT3264(auVar226);
            auVar11 = vfnmadd213ps_fma(auVar136,ZEXT1632(auVar14),auVar226);
            auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar136,auVar136);
            auVar84._4_4_ = auVar16._4_4_ * local_5a0._4_4_;
            auVar84._0_4_ = auVar16._0_4_ * local_5a0._0_4_;
            auVar84._8_4_ = auVar16._8_4_ * local_5a0._8_4_;
            auVar84._12_4_ = auVar16._12_4_ * local_5a0._12_4_;
            auVar84._16_4_ = local_5a0._16_4_ * 0.0;
            auVar84._20_4_ = local_5a0._20_4_ * 0.0;
            auVar84._24_4_ = local_5a0._24_4_ * 0.0;
            auVar84._28_4_ = auVar21._28_4_;
            auVar196 = vfmadd231ps_fma(auVar84,ZEXT1632(auVar196),local_5c0);
            auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),ZEXT1632(auVar15),local_7c0);
            fVar161 = auVar11._0_4_;
            fVar140 = auVar11._4_4_;
            fVar141 = auVar11._8_4_;
            fVar142 = auVar11._12_4_;
            auVar134 = ZEXT1632(CONCAT412(fVar142 * auVar196._12_4_,
                                          CONCAT48(fVar141 * auVar196._8_4_,
                                                   CONCAT44(fVar140 * auVar196._4_4_,
                                                            fVar161 * auVar196._0_4_))));
            fVar162 = (ray->super_RayK<1>).tfar;
            auVar181._4_4_ = fVar162;
            auVar181._0_4_ = fVar162;
            auVar181._8_4_ = fVar162;
            auVar181._12_4_ = fVar162;
            auVar181._16_4_ = fVar162;
            auVar181._20_4_ = fVar162;
            auVar181._24_4_ = fVar162;
            auVar181._28_4_ = fVar162;
            auVar136 = vcmpps_avx(local_3c0,auVar134,2);
            auVar198 = vcmpps_avx(auVar134,auVar181,2);
            auVar136 = vandps_avx(auVar198,auVar136);
            auVar11 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
            auVar20 = vpand_avx(auVar20,auVar11);
            auVar136 = vpmovsxwd_avx2(auVar20);
            auVar196 = ZEXT816(0) << 0x20;
            if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar136 >> 0x7f,0) == '\0') &&
                  (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar136 >> 0xbf,0) == '\0') &&
                (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar136[0x1f]) goto LAB_018165b0;
            auVar136 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,4);
            auVar11 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
            auVar20 = vpand_avx(auVar20,auVar11);
            auVar136 = vpmovsxwd_avx2(auVar20);
            auVar200 = ZEXT3264(auVar136);
            auVar182._8_8_ = local_560[1]._8_8_;
            auVar182._0_8_ = local_560[1]._0_8_;
            auVar182._16_8_ = local_560[1]._16_8_;
            auVar182._24_8_ = local_560[1]._24_8_;
            if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar136 >> 0x7f,0) != '\0') ||
                  (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar136 >> 0xbf,0) != '\0') ||
                (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar136[0x1f] < '\0') {
              auVar152 = ZEXT1632(CONCAT412(fVar142 * auVar12._12_4_,
                                            CONCAT48(fVar141 * auVar12._8_4_,
                                                     CONCAT44(fVar140 * auVar12._4_4_,
                                                              fVar161 * auVar12._0_4_))));
              auVar85._28_4_ = SUB84(local_560[1]._24_8_,4);
              auVar85._0_28_ =
                   ZEXT1628(CONCAT412(fVar142 * auVar13._12_4_,
                                      CONCAT48(fVar141 * auVar13._8_4_,
                                               CONCAT44(fVar140 * auVar13._4_4_,
                                                        fVar161 * auVar13._0_4_))));
              auVar211._8_4_ = 0x3f800000;
              auVar211._0_8_ = 0x3f8000003f800000;
              auVar211._12_4_ = 0x3f800000;
              auVar211._16_4_ = 0x3f800000;
              auVar211._20_4_ = 0x3f800000;
              auVar211._24_4_ = 0x3f800000;
              auVar211._28_4_ = 0x3f800000;
              auVar198 = vsubps_avx(auVar211,auVar152);
              local_120 = vblendvps_avx(auVar198,auVar152,auVar209);
              auVar198 = vsubps_avx(auVar211,auVar85);
              local_440 = vblendvps_avx(auVar198,auVar85,auVar209);
              local_420 = auVar134;
              auVar182 = auVar136;
            }
          }
          auVar236 = ZEXT3264(local_6c0);
          auVar222 = ZEXT3264(local_6a0);
          auVar212 = ZEXT3264(CONCAT428(fStack_5e4,
                                        CONCAT424(fStack_5e8,
                                                  CONCAT420(fStack_5ec,
                                                            CONCAT416(fStack_5f0,
                                                                      CONCAT412(fStack_5f4,
                                                                                CONCAT48(fStack_5f8,
                                                                                         CONCAT44(
                                                  fStack_5fc,local_600))))))));
          auVar155 = local_620;
          if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar182 >> 0x7f,0) != '\0') ||
                (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar182 >> 0xbf,0) != '\0') ||
              (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar182[0x1f] < '\0') {
            auVar136 = vsubps_avx(ZEXT1632(auVar10),auVar137);
            auVar20 = vfmadd213ps_fma(auVar136,local_120,auVar137);
            fVar162 = pre->depth_scale;
            auVar86._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar162;
            auVar86._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar162;
            auVar86._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar162;
            auVar86._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar162;
            auVar86._16_4_ = fVar162 * 0.0;
            auVar86._20_4_ = fVar162 * 0.0;
            auVar86._24_4_ = fVar162 * 0.0;
            auVar86._28_4_ = fVar162;
            auVar200 = ZEXT3264(local_420);
            auVar136 = vcmpps_avx(local_420,auVar86,6);
            auVar198 = auVar182 & auVar136;
            if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar198 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar198 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar198 >> 0x7f,0) != '\0') ||
                  (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar198 >> 0xbf,0) != '\0') ||
                (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar198[0x1f] < '\0') {
              auVar156._8_4_ = 0xbf800000;
              auVar156._0_8_ = 0xbf800000bf800000;
              auVar156._12_4_ = 0xbf800000;
              auVar156._16_4_ = 0xbf800000;
              auVar156._20_4_ = 0xbf800000;
              auVar156._24_4_ = 0xbf800000;
              auVar156._28_4_ = 0xbf800000;
              auVar175._8_4_ = 0x40000000;
              auVar175._0_8_ = 0x4000000040000000;
              auVar175._12_4_ = 0x40000000;
              auVar175._16_4_ = 0x40000000;
              auVar175._20_4_ = 0x40000000;
              auVar175._24_4_ = 0x40000000;
              auVar175._28_4_ = 0x40000000;
              auVar20 = vfmadd213ps_fma(local_440,auVar175,auVar156);
              local_2c0 = local_120;
              local_440 = ZEXT1632(auVar20);
              auVar198 = local_440;
              local_2a0 = ZEXT1632(auVar20);
              local_280 = local_420;
              local_25c = iVar18;
              local_250 = local_710;
              uStack_248 = uStack_708;
              local_240 = local_720;
              uStack_238 = uStack_718;
              local_230 = local_730;
              uStack_228 = uStack_728;
              local_220 = CONCAT44(fStack_73c,local_740);
              uStack_218 = CONCAT44(fStack_734,fStack_738);
              pGVar121 = (context->scene->geometries).items[local_7c8].ptr;
              local_440 = auVar198;
              if ((pGVar121->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar136 = vandps_avx(auVar136,auVar182);
                local_560[0] = auVar136;
                fVar162 = (float)local_260;
                local_1e0[0] = (fVar162 + local_120._0_4_ + 0.0) * local_140;
                local_1e0[1] = (fVar162 + local_120._4_4_ + 1.0) * fStack_13c;
                local_1e0[2] = (fVar162 + local_120._8_4_ + 2.0) * fStack_138;
                local_1e0[3] = (fVar162 + local_120._12_4_ + 3.0) * fStack_134;
                fStack_1d0 = (fVar162 + local_120._16_4_ + 4.0) * fStack_130;
                fStack_1cc = (fVar162 + local_120._20_4_ + 5.0) * fStack_12c;
                fStack_1c8 = (fVar162 + local_120._24_4_ + 6.0) * fStack_128;
                fStack_1c4 = fVar162 + local_120._28_4_ + 7.0;
                local_440._0_8_ = auVar20._0_8_;
                local_440._8_8_ = auVar20._8_8_;
                local_1c0 = local_440._0_8_;
                uStack_1b8 = local_440._8_8_;
                uStack_1b0 = 0;
                uStack_1a8 = 0;
                local_1a0 = local_420;
                auVar157._8_4_ = 0x7f800000;
                auVar157._0_8_ = 0x7f8000007f800000;
                auVar157._12_4_ = 0x7f800000;
                auVar157._16_4_ = 0x7f800000;
                auVar157._20_4_ = 0x7f800000;
                auVar157._24_4_ = 0x7f800000;
                auVar157._28_4_ = 0x7f800000;
                auVar198 = vblendvps_avx(auVar157,local_420,auVar136);
                auVar134 = vshufps_avx(auVar198,auVar198,0xb1);
                auVar134 = vminps_avx(auVar198,auVar134);
                auVar152 = vshufpd_avx(auVar134,auVar134,5);
                auVar134 = vminps_avx(auVar134,auVar152);
                auVar152 = vpermpd_avx2(auVar134,0x4e);
                auVar134 = vminps_avx(auVar134,auVar152);
                auVar198 = vcmpps_avx(auVar198,auVar134,0);
                auVar134 = auVar136 & auVar198;
                if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar134 >> 0x7f,0) != '\0') ||
                      (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0xbf,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar134[0x1f] < '\0') {
                  auVar136 = vandps_avx(auVar198,auVar136);
                }
                uVar118 = vmovmskps_avx(auVar136);
                uVar116 = 0;
                for (; (uVar118 & 1) == 0; uVar118 = uVar118 >> 1 | 0x80000000) {
                  uVar116 = uVar116 + 1;
                }
                uVar119 = (ulong)uVar116;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar121->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_7a0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_7c0._0_8_ = pGVar121;
                  _local_360 = auVar147;
                  do {
                    local_664 = local_1e0[uVar119];
                    local_660 = *(undefined4 *)((long)&local_1c0 + uVar119 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar119 * 4);
                    local_6f0.context = context->user;
                    fVar161 = 1.0 - local_664;
                    fVar162 = fVar161 * fVar161 * -3.0;
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),
                                              ZEXT416((uint)(local_664 * fVar161)),
                                              ZEXT416(0xc0000000));
                    auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_664 * fVar161)),
                                              ZEXT416((uint)(local_664 * local_664)),
                                              ZEXT416(0x40000000));
                    auVar200 = ZEXT464(0x40400000);
                    fVar161 = auVar20._0_4_ * 3.0;
                    fVar140 = auVar10._0_4_ * 3.0;
                    fVar141 = local_664 * local_664 * 3.0;
                    auVar190._0_4_ = fVar141 * local_740;
                    auVar190._4_4_ = fVar141 * fStack_73c;
                    auVar190._8_4_ = fVar141 * fStack_738;
                    auVar190._12_4_ = fVar141 * fStack_734;
                    auVar167._4_4_ = fVar140;
                    auVar167._0_4_ = fVar140;
                    auVar167._8_4_ = fVar140;
                    auVar167._12_4_ = fVar140;
                    auVar104._8_8_ = uStack_728;
                    auVar104._0_8_ = local_730;
                    auVar20 = vfmadd132ps_fma(auVar167,auVar190,auVar104);
                    auVar179._4_4_ = fVar161;
                    auVar179._0_4_ = fVar161;
                    auVar179._8_4_ = fVar161;
                    auVar179._12_4_ = fVar161;
                    auVar107._8_8_ = uStack_718;
                    auVar107._0_8_ = local_720;
                    auVar20 = vfmadd132ps_fma(auVar179,auVar20,auVar107);
                    auVar168._4_4_ = fVar162;
                    auVar168._0_4_ = fVar162;
                    auVar168._8_4_ = fVar162;
                    auVar168._12_4_ = fVar162;
                    auVar110._8_8_ = uStack_708;
                    auVar110._0_8_ = local_710;
                    auVar20 = vfmadd132ps_fma(auVar168,auVar20,auVar110);
                    local_670 = vmovlps_avx(auVar20);
                    local_668 = vextractps_avx(auVar20,2);
                    local_65c = (int)local_748;
                    local_658 = (int)local_7c8;
                    local_654 = (local_6f0.context)->instID[0];
                    local_650 = (local_6f0.context)->instPrimID[0];
                    local_7cc = -1;
                    local_6f0.valid = &local_7cc;
                    local_6f0.geometryUserPtr = pGVar121->userPtr;
                    local_6f0.ray = (RTCRayN *)ray;
                    local_6f0.hit = (RTCHitN *)&local_670;
                    local_6f0.N = 1;
                    local_780._0_8_ = uVar119;
                    if (pGVar121->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0181676f:
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar121->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar200 = ZEXT1664(auVar200._0_16_);
                        auVar227 = ZEXT1664(auVar227._0_16_);
                        (*p_Var19)(&local_6f0);
                        pGVar121 = (Geometry *)local_7c0._0_8_;
                        uVar119 = local_780._0_8_;
                        if (*local_6f0.valid == 0) goto LAB_01816813;
                      }
                      (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).components[0] =
                           *(float *)local_6f0.hit;
                      (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_6f0.hit + 4);
                      (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_6f0.hit + 8);
                      *(float *)((long)local_6f0.ray + 0x3c) = *(float *)(local_6f0.hit + 0xc);
                      *(float *)((long)local_6f0.ray + 0x40) = *(float *)(local_6f0.hit + 0x10);
                      *(float *)((long)local_6f0.ray + 0x44) = *(float *)(local_6f0.hit + 0x14);
                      *(float *)((long)local_6f0.ray + 0x48) = *(float *)(local_6f0.hit + 0x18);
                      *(float *)((long)local_6f0.ray + 0x4c) = *(float *)(local_6f0.hit + 0x1c);
                      *(float *)((long)local_6f0.ray + 0x50) = *(float *)(local_6f0.hit + 0x20);
                    }
                    else {
                      auVar200 = ZEXT1664(auVar200._0_16_);
                      auVar227 = ZEXT1664(auVar227._0_16_);
                      (*pGVar121->intersectionFilterN)(&local_6f0);
                      pGVar121 = (Geometry *)local_7c0._0_8_;
                      uVar119 = local_780._0_8_;
                      if (*local_6f0.valid != 0) goto LAB_0181676f;
LAB_01816813:
                      (ray->super_RayK<1>).tfar = (float)local_7a0._0_4_;
                      pGVar121 = (Geometry *)local_7c0._0_8_;
                      uVar119 = local_780._0_8_;
                    }
                    *(undefined4 *)(local_560[0] + uVar119 * 4) = 0;
                    auVar134 = local_560[0];
                    fVar162 = (ray->super_RayK<1>).tfar;
                    auVar138._4_4_ = fVar162;
                    auVar138._0_4_ = fVar162;
                    auVar138._8_4_ = fVar162;
                    auVar138._12_4_ = fVar162;
                    auVar138._16_4_ = fVar162;
                    auVar138._20_4_ = fVar162;
                    auVar138._24_4_ = fVar162;
                    auVar138._28_4_ = fVar162;
                    auVar198 = vcmpps_avx(local_420,auVar138,2);
                    auVar136 = vandps_avx(auVar198,local_560[0]);
                    local_560[0] = auVar136;
                    auVar134 = auVar134 & auVar198;
                    if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar134 >> 0x7f,0) == '\0') &&
                          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar134 >> 0xbf,0) == '\0') &&
                        (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar134[0x1f]) goto LAB_018168af;
                    auVar158._8_4_ = 0x7f800000;
                    auVar158._0_8_ = 0x7f8000007f800000;
                    auVar158._12_4_ = 0x7f800000;
                    auVar158._16_4_ = 0x7f800000;
                    auVar158._20_4_ = 0x7f800000;
                    auVar158._24_4_ = 0x7f800000;
                    auVar158._28_4_ = 0x7f800000;
                    auVar198 = vblendvps_avx(auVar158,local_420,auVar136);
                    auVar134 = vshufps_avx(auVar198,auVar198,0xb1);
                    auVar134 = vminps_avx(auVar198,auVar134);
                    auVar152 = vshufpd_avx(auVar134,auVar134,5);
                    auVar134 = vminps_avx(auVar134,auVar152);
                    auVar152 = vpermpd_avx2(auVar134,0x4e);
                    auVar134 = vminps_avx(auVar134,auVar152);
                    auVar198 = vcmpps_avx(auVar198,auVar134,0);
                    auVar134 = auVar136 & auVar198;
                    if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar134 >> 0x7f,0) != '\0') ||
                          (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar134 >> 0xbf,0) != '\0') ||
                        (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar134[0x1f] < '\0') {
                      auVar136 = vandps_avx(auVar198,auVar136);
                    }
                    local_7a0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    uVar118 = vmovmskps_avx(auVar136);
                    uVar116 = 0;
                    for (; (uVar118 & 1) == 0; uVar118 = uVar118 >> 1 | 0x80000000) {
                      uVar116 = uVar116 + 1;
                    }
                    uVar119 = (ulong)uVar116;
                  } while( true );
                }
                fVar162 = local_1e0[uVar119];
                fVar161 = *(float *)((long)&local_1c0 + uVar119 * 4);
                fVar141 = 1.0 - fVar162;
                fVar140 = fVar141 * fVar141 * -3.0;
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),
                                          ZEXT416((uint)(fVar162 * fVar141)),ZEXT416(0xc0000000));
                auVar10 = vfmsub132ss_fma(ZEXT416((uint)(fVar162 * fVar141)),
                                          ZEXT416((uint)(fVar162 * fVar162)),ZEXT416(0x40000000));
                auVar200 = ZEXT464(0x40400000);
                fVar141 = auVar20._0_4_ * 3.0;
                fVar142 = auVar10._0_4_ * 3.0;
                fVar143 = fVar162 * fVar162 * 3.0;
                auVar189._0_4_ = fVar143 * local_740;
                auVar189._4_4_ = fVar143 * fStack_73c;
                auVar189._8_4_ = fVar143 * fStack_738;
                auVar189._12_4_ = fVar143 * fStack_734;
                auVar165._4_4_ = fVar142;
                auVar165._0_4_ = fVar142;
                auVar165._8_4_ = fVar142;
                auVar165._12_4_ = fVar142;
                auVar103._8_8_ = uStack_728;
                auVar103._0_8_ = local_730;
                auVar20 = vfmadd132ps_fma(auVar165,auVar189,auVar103);
                auVar178._4_4_ = fVar141;
                auVar178._0_4_ = fVar141;
                auVar178._8_4_ = fVar141;
                auVar178._12_4_ = fVar141;
                auVar106._8_8_ = uStack_718;
                auVar106._0_8_ = local_720;
                auVar20 = vfmadd132ps_fma(auVar178,auVar20,auVar106);
                auVar166._4_4_ = fVar140;
                auVar166._0_4_ = fVar140;
                auVar166._8_4_ = fVar140;
                auVar166._12_4_ = fVar140;
                auVar109._8_8_ = uStack_708;
                auVar109._0_8_ = local_710;
                auVar20 = vfmadd132ps_fma(auVar166,auVar20,auVar109);
                (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar119 * 4);
                uVar125 = vmovlps_avx(auVar20);
                *(undefined8 *)&(ray->Ng).field_0 = uVar125;
                fVar140 = (float)vextractps_avx(auVar20,2);
                (ray->Ng).field_0.field_0.z = fVar140;
                ray->u = fVar162;
                ray->v = fVar161;
                ray->primID = (uint)local_748;
                ray->geomID = (uint)local_7c8;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                prim = local_700;
              }
            }
          }
        }
        goto LAB_0181657a;
      }
LAB_01815808:
      fVar162 = (ray->super_RayK<1>).tfar;
      auVar135._4_4_ = fVar162;
      auVar135._0_4_ = fVar162;
      auVar135._8_4_ = fVar162;
      auVar135._12_4_ = fVar162;
      auVar135._16_4_ = fVar162;
      auVar135._20_4_ = fVar162;
      auVar135._24_4_ = fVar162;
      auVar135._28_4_ = fVar162;
      auVar136 = vcmpps_avx(local_80,auVar135,2);
      uVar116 = vmovmskps_avx(auVar136);
      uVar116 = (uint)uVar122 & uVar116;
    } while (uVar116 != 0);
  }
  return;
LAB_018168af:
  auVar212 = ZEXT3264(CONCAT428(fStack_5e4,
                                CONCAT424(fStack_5e8,
                                          CONCAT420(fStack_5ec,
                                                    CONCAT416(fStack_5f0,
                                                              CONCAT412(fStack_5f4,
                                                                        CONCAT48(fStack_5f8,
                                                                                 CONCAT44(fStack_5fc
                                                                                          ,local_600
                                                                                         ))))))));
  auVar222 = ZEXT3264(local_6a0);
  auVar236 = ZEXT3264(local_6c0);
  prim = local_700;
  pre = local_6f8;
  auVar155 = local_620;
LAB_0181657a:
  auVar160 = ZEXT3264(auVar155);
  lVar123 = lVar123 + 8;
  auVar183 = ZEXT3264(local_580);
  if (iVar18 <= (int)lVar123) goto LAB_01815808;
  goto LAB_01815b2e;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }